

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  stbi__uint32 *y_00;
  int *piVar1;
  anon_struct_96_18_0d0905d3 *paVar2;
  undefined8 *puVar3;
  byte bVar4;
  short sVar5;
  short sVar6;
  stbi__uint32 sVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  short sVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 z;
  undefined4 z_00;
  undefined4 z_01;
  stbi_uc sVar39;
  byte bVar40;
  uchar uVar41;
  int iVar42;
  uint uVar43;
  stbi__uint32 sVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  uint uVar48;
  uint uVar49;
  int iVar50;
  void *pvVar51;
  stbi__jpeg *psVar52;
  stbi__uint16 *psVar53;
  uchar *puVar54;
  void *pvVar55;
  code *pcVar56;
  undefined8 *puVar57;
  uchar *puVar58;
  uint uVar59;
  long lVar60;
  undefined8 *puVar61;
  byte *pbVar62;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar63;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  int why_00;
  uint uVar64;
  undefined8 extraout_RDX;
  undefined8 uVar65;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  anon_struct_96_18_0d0905d3 *extraout_RDX_03;
  anon_struct_96_18_0d0905d3 *extraout_RDX_04;
  anon_struct_96_18_0d0905d3 *paVar66;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  stbi_uc *extraout_RDX_15;
  stbi_uc *extraout_RDX_16;
  stbi_uc *psVar67;
  uint uVar68;
  undefined1 *puVar69;
  stbi_uc *psVar70;
  long lVar71;
  ulong uVar72;
  long lVar73;
  undefined7 uVar74;
  int iVar75;
  ulong uVar76;
  stbi__context *psVar77;
  undefined8 *puVar78;
  short *psVar79;
  stbi__uint16 *psVar80;
  ulong uVar81;
  bool bVar82;
  bool bVar83;
  undefined1 auVar84 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  int iVar119;
  int iVar123;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar124 [16];
  stbi_uc *coutput [4];
  stbi_uc pal [256] [4];
  short local_538;
  ulong local_520;
  ulong local_508;
  undefined1 local_4d8 [12];
  uint uStack_4cc;
  undefined1 local_4c8 [12];
  uint uStack_4bc;
  int local_4b8;
  long local_4b0;
  uint local_4a8;
  int local_4a4;
  anon_struct_96_18_0d0905d3 *local_4a0;
  ulong local_498;
  uint local_48c;
  int *local_488;
  uint *local_480;
  stbi__uint32 *local_478;
  ulong local_470;
  long local_468;
  uint local_45c;
  int local_458;
  int local_454;
  int local_450;
  int local_44c;
  ulong local_448;
  ulong local_440;
  stbi__png local_438;
  int aiStack_410 [248];
  
  uVar81 = (ulong)(uint)req_comp;
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  iVar42 = stbi__check_png_header(s);
  iVar46 = (int)uVar81;
  psVar67 = s->img_buffer_original;
  s->img_buffer = psVar67;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar42 != 0) {
    if (4 < (uint)req_comp) {
      stbi__g_failure_reason = "bad req_comp";
      return (void *)0x0;
    }
    local_438.s = s;
    iVar42 = stbi__parse_png_file(&local_438,0,req_comp);
    psVar53 = (stbi__uint16 *)local_438.out;
    psVar77 = local_438.s;
    psVar80 = (stbi__uint16 *)0x0;
    if (iVar42 != 0) {
      iVar42 = 8;
      if ((8 < local_438.depth) && (iVar42 = 0x10, local_438.depth != 0x10)) {
        stbi__g_failure_reason = "bad bits_per_channel";
        return (void *)0x0;
      }
      ri->bits_per_channel = iVar42;
      local_438.out = (stbi_uc *)0x0;
      if ((req_comp != 0) && (iVar42 = (local_438.s)->img_out_n, iVar42 != req_comp)) {
        if (local_438.depth < 9) {
          psVar53 = (stbi__uint16 *)
                    stbi__convert_format
                              ((uchar *)psVar53,iVar42,req_comp,(local_438.s)->img_x,
                               (local_438.s)->img_y);
        }
        else {
          psVar53 = stbi__convert_format16
                              (psVar53,iVar42,req_comp,(local_438.s)->img_x,(local_438.s)->img_y);
        }
        psVar77->img_out_n = req_comp;
        if (psVar53 == (stbi__uint16 *)0x0) {
          return (void *)0x0;
        }
      }
      *x = (local_438.s)->img_x;
      *y = (local_438.s)->img_y;
      psVar80 = psVar53;
      if (comp != (int *)0x0) {
        *comp = (local_438.s)->img_n;
      }
    }
    free(local_438.out);
    local_438.out = (stbi_uc *)0x0;
    free(local_438.expanded);
    local_438.expanded = (stbi_uc *)0x0;
    free(local_438.idata);
    return psVar80;
  }
  if (psVar67 < s->img_buffer_original_end) {
LAB_0016f285:
    iVar46 = (int)uVar81;
    s->img_buffer = psVar67 + 1;
    if (*psVar67 == 'B') {
      psVar67 = s->img_buffer;
      if (s->img_buffer_end <= psVar67) {
        if (s->read_from_callbacks == 0) goto LAB_0016f3f9;
        stbi__refill_buffer(s);
        psVar67 = s->img_buffer;
      }
      iVar46 = (int)uVar81;
      s->img_buffer = psVar67 + 1;
      if (*psVar67 == 'M') {
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar43 = stbi__get16le(s);
        iVar42 = stbi__get16le(s);
        iVar46 = (int)uVar81;
        uVar43 = iVar42 << 0x10 | uVar43;
        if ((((uVar43 < 0x39) && ((0x100010000001000U >> ((ulong)uVar43 & 0x3f) & 1) != 0)) ||
            (uVar43 == 0x7c)) || (uVar43 == 0x6c)) {
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
          uStack_4bc = 0xff;
          pvVar51 = stbi__bmp_parse_header(s,(stbi__bmp_data *)local_4d8);
          if (pvVar51 == (void *)0x0) {
            return (void *)0x0;
          }
          local_45c = s->img_y;
          uVar43 = -local_45c;
          if (0 < (int)local_45c) {
            uVar43 = local_45c;
          }
          s->img_y = uVar43;
          if ((0x1000000 < uVar43) || (0x1000000 < s->img_x)) goto LAB_00170edd;
          uVar38 = local_4d8._8_4_;
          if (local_4d8._8_4_ == 0xc) {
            if ((int)local_4d8._0_4_ < 0x18) {
              uVar72 = (ulong)(uint)(((local_4d8._4_4_ - local_4b8) + -0x18) / 3);
            }
            else {
LAB_00170dd2:
              uVar72 = 0;
            }
          }
          else {
            if (0xf < (int)local_4d8._0_4_) goto LAB_00170dd2;
            uVar72 = (ulong)(uint)(local_4d8._4_4_ - (local_4b8 + local_4d8._8_4_) >> 2);
          }
          uVar43 = uStack_4cc;
          z = local_4c8._0_4_;
          z_00 = local_4c8._4_4_;
          z_01 = local_4c8._8_4_;
          uVar64 = uStack_4bc;
          iVar42 = (int)uVar72;
          local_478 = (stbi__uint32 *)y;
          if (iVar42 == 0) {
            iVar46 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) +
                     s->callback_already_read;
            if (iVar46 - 0x401U < 0xfffffc00) {
              stbi__g_failure_reason = "bad header";
              return (void *)0x0;
            }
            if (((int)local_4d8._4_4_ < iVar46) || (0x400 < local_4d8._4_4_ - iVar46)) {
              stbi__g_failure_reason = "bad offset";
              return (void *)0x0;
            }
            stbi__skip(s,local_4d8._4_4_ - iVar46);
          }
          uVar37 = local_4d8._0_4_;
          uVar68 = z_01 ^ 0xff000000;
          s->img_n = 4 - (uint)(z_01 == 0 || local_4d8._0_4_ == 0x18 && uVar68 == 0);
          iVar46 = req_comp;
          if (req_comp < 3) {
            iVar46 = s->img_n;
          }
          sVar44 = s->img_x;
          sVar7 = s->img_y;
          iVar45 = stbi__mad3sizes_valid(iVar46,sVar44,sVar7,0);
          if (iVar45 == 0) goto LAB_00170edd;
          local_480 = (uint *)x;
          puVar54 = (uchar *)stbi__malloc_mad3(iVar46,sVar44,sVar7,0);
          if (puVar54 == (uchar *)0x0) goto LAB_00170ee6;
          if ((int)uVar37 < 0x10) {
            if (0x100 < iVar42 || iVar42 == 0) {
              free(puVar54);
              stbi__g_failure_reason = "invalid";
              return (void *)0x0;
            }
            if (0 < iVar42) {
              uVar81 = 0;
              do {
                psVar67 = s->img_buffer;
                if (psVar67 < s->img_buffer_end) {
LAB_001719be:
                  s->img_buffer = psVar67 + 1;
                  sVar39 = *psVar67;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar67 = s->img_buffer;
                    goto LAB_001719be;
                  }
                  sVar39 = '\0';
                }
                *(stbi_uc *)((long)&local_438.s + uVar81 * 4 + 2) = sVar39;
                psVar67 = s->img_buffer;
                if (psVar67 < s->img_buffer_end) {
LAB_001719fd:
                  s->img_buffer = psVar67 + 1;
                  sVar39 = *psVar67;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar67 = s->img_buffer;
                    goto LAB_001719fd;
                  }
                  sVar39 = '\0';
                }
                *(stbi_uc *)((long)&local_438.s + uVar81 * 4 + 1) = sVar39;
                psVar67 = s->img_buffer;
                if (psVar67 < s->img_buffer_end) {
LAB_00171a38:
                  s->img_buffer = psVar67 + 1;
                  sVar39 = *psVar67;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar67 = s->img_buffer;
                    goto LAB_00171a38;
                  }
                  sVar39 = '\0';
                }
                *(stbi_uc *)((long)&local_438.s + uVar81 * 4) = sVar39;
                if (uVar38 != 0xc) {
                  psVar67 = s->img_buffer;
                  if (s->img_buffer_end <= psVar67) {
                    if (s->read_from_callbacks == 0) goto LAB_00171a83;
                    stbi__refill_buffer(s);
                    psVar67 = s->img_buffer;
                  }
                  s->img_buffer = psVar67 + 1;
                }
LAB_00171a83:
                *(undefined1 *)((long)&local_438.s + uVar81 * 4 + 3) = 0xff;
                uVar81 = uVar81 + 1;
              } while (uVar72 != uVar81);
            }
            stbi__skip(s,(iVar42 * (uVar38 == 0xc | 0xfffffffc) + local_4d8._4_4_) -
                         (uVar38 + local_4b8));
            if (uVar37 == 8) {
              uVar43 = s->img_x;
            }
            else if (uVar37 == 4) {
              uVar43 = s->img_x + 1 >> 1;
            }
            else {
              if (uVar37 != 1) {
                free(puVar54);
                stbi__g_failure_reason = "bad bpp";
                return (void *)0x0;
              }
              uVar43 = s->img_x + 7 >> 3;
            }
            if (uVar37 == 1) {
              if (0 < (int)s->img_y) {
                iVar42 = 0;
                iVar45 = 0;
                do {
                  pbVar62 = s->img_buffer;
                  if (pbVar62 < s->img_buffer_end) {
LAB_00171dac:
                    s->img_buffer = pbVar62 + 1;
                    uVar68 = (uint)*pbVar62;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar62 = s->img_buffer;
                      goto LAB_00171dac;
                    }
                    uVar68 = 0;
                  }
                  uVar59 = 7;
                  sVar44 = 1;
                  do {
                    sVar7 = s->img_x;
                    if ((int)sVar7 <= (int)(sVar44 - 1)) break;
                    uVar72 = (ulong)((uVar68 >> (uVar59 & 0x1f) & 1) != 0);
                    lVar71 = (long)iVar42;
                    uVar81 = lVar71 + 3;
                    puVar54[lVar71] = *(uchar *)((long)&local_438.s + uVar72 * 4);
                    puVar54[lVar71 + 1] = *(uchar *)((long)&local_438.s + uVar72 * 4 + 1);
                    puVar54[lVar71 + 2] = *(uchar *)((long)&local_438.s + uVar72 * 4 + 2);
                    if (iVar46 == 4) {
                      puVar54[uVar81] = 0xff;
                      uVar81 = (ulong)(iVar42 + 4);
                    }
                    iVar42 = (int)uVar81;
                    if (sVar44 != sVar7) {
                      if ((int)uVar59 < 1) {
                        pbVar62 = s->img_buffer;
                        if (pbVar62 < s->img_buffer_end) {
LAB_00171e5a:
                          s->img_buffer = pbVar62 + 1;
                          uVar68 = (uint)*pbVar62;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            stbi__refill_buffer(s);
                            pbVar62 = s->img_buffer;
                            goto LAB_00171e5a;
                          }
                          uVar68 = 0;
                        }
                        uVar59 = 7;
                      }
                      else {
                        uVar59 = uVar59 - 1;
                      }
                    }
                    bVar83 = sVar44 != sVar7;
                    sVar44 = sVar44 + 1;
                  } while (bVar83);
                  stbi__skip(s,-uVar43 & 3);
                  iVar45 = iVar45 + 1;
                } while (iVar45 < (int)s->img_y);
              }
            }
            else if (0 < (int)s->img_y) {
              uVar81 = 0;
              iVar42 = 0;
              do {
                if (0 < (int)s->img_x) {
                  iVar45 = 0;
                  do {
                    pbVar62 = s->img_buffer;
                    if (pbVar62 < s->img_buffer_end) {
LAB_00171f15:
                      s->img_buffer = pbVar62 + 1;
                      uVar68 = (uint)*pbVar62;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        pbVar62 = s->img_buffer;
                        goto LAB_00171f15;
                      }
                      uVar68 = 0;
                    }
                    uVar59 = uVar68 >> 4;
                    if (uVar37 != 4) {
                      uVar59 = uVar68;
                    }
                    uVar72 = (ulong)uVar59;
                    uVar68 = uVar68 & 0xf;
                    if (uVar37 != 4) {
                      uVar68 = 0;
                    }
                    lVar71 = (long)(int)uVar81;
                    uVar76 = lVar71 + 3;
                    puVar54[lVar71] = *(uchar *)((long)&local_438.s + uVar72 * 4);
                    puVar54[lVar71 + 1] = *(uchar *)((long)&local_438.s + uVar72 * 4 + 1);
                    puVar54[lVar71 + 2] = *(uchar *)((long)&local_438.s + uVar72 * 4 + 2);
                    if (iVar46 == 4) {
                      puVar54[uVar76] = 0xff;
                      uVar76 = (ulong)((int)uVar81 + 4);
                    }
                    uVar59 = (uint)uVar76;
                    sVar44 = s->img_x;
                    if (iVar45 + 1U == sVar44) {
LAB_0017200d:
                      uVar81 = (ulong)uVar59;
                    }
                    else {
                      if (uVar37 == 8) {
                        pbVar62 = s->img_buffer;
                        if (s->img_buffer_end <= pbVar62) {
                          if (s->read_from_callbacks == 0) {
                            uVar68 = 0;
                            goto LAB_00171fd1;
                          }
                          stbi__refill_buffer(s);
                          pbVar62 = s->img_buffer;
                        }
                        s->img_buffer = pbVar62 + 1;
                        uVar68 = (uint)*pbVar62;
                      }
LAB_00171fd1:
                      lVar71 = (long)(int)uVar59;
                      uVar81 = lVar71 + 3;
                      uVar72 = (ulong)uVar68;
                      puVar54[lVar71] = *(uchar *)((long)&local_438.s + uVar72 * 4);
                      puVar54[lVar71 + 1] = *(uchar *)((long)&local_438.s + uVar72 * 4 + 1);
                      puVar54[lVar71 + 2] = *(uchar *)((long)&local_438.s + uVar72 * 4 + 2);
                      if (iVar46 == 4) {
                        uVar59 = uVar59 + 4;
                        puVar54[uVar81] = 0xff;
                        goto LAB_0017200d;
                      }
                    }
                  } while ((iVar45 + 1U != sVar44) && (iVar45 = iVar45 + 2, iVar45 < (int)s->img_x))
                  ;
                }
                stbi__skip(s,-uVar43 & 3);
                iVar42 = iVar42 + 1;
              } while (iVar42 < (int)s->img_y);
            }
            goto LAB_00172493;
          }
          stbi__skip(s,local_4d8._4_4_ - (uVar38 + local_4b8));
          if (uVar37 == 0x18) {
            iVar42 = -3;
LAB_00171b35:
            uVar59 = iVar42 * s->img_x & 3;
          }
          else {
            uVar59 = 0;
            if (uVar37 == 0x10) {
              iVar42 = -2;
              goto LAB_00171b35;
            }
          }
          iVar42 = 0;
          if (uVar37 == 0x18) {
            uVar81 = 0;
LAB_00171b7d:
            bVar83 = false;
          }
          else {
            uVar74 = (undefined7)(uVar81 >> 8);
            if (uVar37 != 0x20) {
              uVar81 = CONCAT71(uVar74,1);
              goto LAB_00171b7d;
            }
            bVar83 = (uVar43 == 0xff0000 && (z == 0xff00 && z_00 == 0xff)) && uVar68 == 0;
            uVar81 = CONCAT71(uVar74,(uVar43 != 0xff0000 || (z != 0xff00 || z_00 != 0xff)) ||
                                     uVar68 != 0);
          }
          iVar45 = 0;
          iVar47 = 0;
          iVar75 = 0;
          uVar68 = 0;
          uVar48 = 0;
          uVar49 = 0;
          local_48c = (uint)uVar81;
          uVar63 = 0;
          if ((char)uVar81 == '\0') {
LAB_0017209b:
            if (0 < (int)s->img_y) {
              local_4b0 = CONCAT44(local_4b0._4_4_,-iVar42);
              local_4a0 = (anon_struct_96_18_0d0905d3 *)CONCAT44(local_4a0._4_4_,8 - uVar63);
              local_488 = (int *)CONCAT44(local_488._4_4_,-iVar45);
              local_468 = CONCAT44(local_468._4_4_,8 - uVar68);
              local_44c = -iVar47;
              local_450 = 8 - uVar48;
              local_458 = -iVar75;
              local_454 = 8 - uVar49;
              iVar123 = 0;
              local_498 = (ulong)(uVar63 << 2);
              local_470 = (ulong)(uVar68 << 2);
              local_440 = (ulong)(uVar48 << 2);
              local_448 = (ulong)(uVar49 << 2);
              iVar119 = 0;
              local_4a8 = uVar59;
              local_4a4 = iVar75;
              do {
                if ((char)uVar81 == '\0') {
                  if (0 < (int)s->img_x) {
                    iVar75 = 0;
                    do {
                      puVar58 = s->img_buffer;
                      if (puVar58 < s->img_buffer_end) {
LAB_0017232a:
                        s->img_buffer = puVar58 + 1;
                        uVar41 = *puVar58;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          puVar58 = s->img_buffer;
                          goto LAB_0017232a;
                        }
                        uVar41 = '\0';
                      }
                      lVar71 = (long)iVar123;
                      puVar54[lVar71 + 2] = uVar41;
                      puVar58 = s->img_buffer;
                      if (puVar58 < s->img_buffer_end) {
LAB_0017236d:
                        s->img_buffer = puVar58 + 1;
                        uVar41 = *puVar58;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          puVar58 = s->img_buffer;
                          goto LAB_0017236d;
                        }
                        uVar41 = '\0';
                      }
                      puVar54[lVar71 + 1] = uVar41;
                      puVar58 = s->img_buffer;
                      if (puVar58 < s->img_buffer_end) {
LAB_001723ad:
                        s->img_buffer = puVar58 + 1;
                        uVar41 = *puVar58;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          puVar58 = s->img_buffer;
                          goto LAB_001723ad;
                        }
                        uVar41 = '\0';
                      }
                      puVar54[lVar71] = uVar41;
                      bVar40 = 0xff;
                      if (bVar83) {
                        pbVar62 = s->img_buffer;
                        if (s->img_buffer_end <= pbVar62) {
                          if (s->read_from_callbacks == 0) {
                            bVar40 = 0;
                            goto LAB_001723ff;
                          }
                          stbi__refill_buffer(s);
                          pbVar62 = s->img_buffer;
                        }
                        s->img_buffer = pbVar62 + 1;
                        bVar40 = *pbVar62;
                      }
LAB_001723ff:
                      uVar81 = lVar71 + 3;
                      if (iVar46 == 4) {
                        puVar54[uVar81] = bVar40;
                        uVar81 = (ulong)(iVar123 + 4);
                      }
                      uVar64 = uVar64 | bVar40;
                      iVar75 = iVar75 + 1;
                      iVar123 = (int)uVar81;
                    } while (iVar75 < (int)s->img_x);
                  }
                }
                else if (0 < (int)s->img_x) {
                  iVar75 = 0;
                  do {
                    uVar68 = stbi__get16le(s);
                    if (uVar37 != 0x10) {
                      iVar50 = stbi__get16le(s);
                      uVar68 = uVar68 | iVar50 << 0x10;
                    }
                    uVar59 = (uVar68 & uVar43) >> ((byte)iVar42 & 0x1f);
                    if (iVar42 < 0) {
                      uVar59 = (uVar68 & uVar43) << ((byte)local_4b0 & 0x1f);
                    }
                    uVar63 = (uVar68 & z) >> ((byte)iVar45 & 0x1f);
                    if (iVar45 < 0) {
                      uVar63 = (uVar68 & z) << ((byte)local_488 & 0x1f);
                    }
                    iVar50 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table + local_470
                                     );
                    bVar40 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_470];
                    uVar48 = (uVar68 & z_00) >> ((byte)iVar47 & 0x1f);
                    if (iVar47 < 0) {
                      uVar48 = (uVar68 & z_00) << ((byte)local_44c & 0x1f);
                    }
                    lVar71 = (long)iVar123;
                    iVar8 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table + local_440)
                    ;
                    bVar4 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_440];
                    puVar54[lVar71] =
                         (uchar)((int)((uVar59 >> ((byte)local_4a0 & 0x1f)) *
                                      *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                              local_498)) >>
                                (stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_498] &
                                0x1f));
                    puVar54[lVar71 + 1] =
                         (uchar)((int)((uVar63 >> ((byte)local_468 & 0x1f)) * iVar50) >>
                                (bVar40 & 0x1f));
                    puVar54[lVar71 + 2] =
                         (uchar)((int)((uVar48 >> ((byte)local_450 & 0x1f)) * iVar8) >>
                                (bVar4 & 0x1f));
                    if (z_01 == 0) {
                      uVar68 = 0xff;
                    }
                    else {
                      uVar59 = (uVar68 & z_01) >> ((byte)local_4a4 & 0x1f);
                      if (local_4a4 < 0) {
                        uVar59 = (uVar68 & z_01) << ((byte)local_458 & 0x1f);
                      }
                      uVar68 = (int)((uVar59 >> ((byte)local_454 & 0x1f)) *
                                    *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                            local_448)) >>
                               (stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_448] &
                               0x1f);
                    }
                    uVar81 = lVar71 + 3;
                    if (iVar46 == 4) {
                      puVar54[uVar81] = (uchar)uVar68;
                      uVar81 = (ulong)(iVar123 + 4);
                    }
                    uVar64 = uVar64 | uVar68;
                    iVar75 = iVar75 + 1;
                    iVar123 = (int)uVar81;
                  } while (iVar75 < (int)s->img_x);
                }
                stbi__skip(s,local_4a8);
                iVar119 = iVar119 + 1;
                uVar81 = (ulong)local_48c;
              } while (iVar119 < (int)s->img_y);
            }
            bVar83 = true;
          }
          else {
            if (z_00 != 0 && (z != 0 && uVar43 != 0)) {
              local_4a8 = uVar59;
              iVar42 = stbi__high_bit(uVar43);
              iVar45 = stbi__bitcount(uVar43);
              local_4b0 = CONCAT44(local_4b0._4_4_,iVar45);
              iVar45 = stbi__high_bit(z);
              iVar47 = stbi__bitcount(z);
              local_4a0 = (anon_struct_96_18_0d0905d3 *)CONCAT44(local_4a0._4_4_,iVar47);
              iVar47 = stbi__high_bit(z_00);
              uVar48 = stbi__bitcount(z_00);
              local_4a4 = stbi__high_bit(z_01);
              uVar68 = (uint)local_4a0;
              uVar49 = stbi__bitcount(z_01);
              uVar81 = (ulong)local_48c;
              if ((uVar49 < 9 && uVar48 < 9) && (uVar68 < 9 && (uint)local_4b0 < 9)) {
                iVar42 = iVar42 + -7;
                iVar45 = iVar45 + -7;
                iVar47 = iVar47 + -7;
                iVar75 = local_4a4 + -7;
                uVar63 = (uint)local_4b0;
                uVar59 = local_4a8;
                goto LAB_0017209b;
              }
            }
            free(puVar54);
            stbi__g_failure_reason = "bad masks";
            bVar83 = false;
          }
          if (!bVar83) {
            return (void *)0x0;
          }
LAB_00172493:
          auVar36 = _DAT_005aa880;
          auVar35 = _DAT_005aa870;
          auVar34 = _DAT_005aa860;
          auVar33 = _DAT_005aa850;
          auVar32 = _DAT_005aa0b0;
          auVar31 = _DAT_005aa0a0;
          auVar124 = _DAT_005aa090;
          if (((iVar46 == 4) && (uVar64 == 0)) &&
             (uVar43 = s->img_x * s->img_y * 4 - 1, -1 < (int)uVar43)) {
            uVar64 = uVar43 >> 2;
            auVar84._4_4_ = 0;
            auVar84._0_4_ = uVar64;
            auVar84._8_4_ = uVar64;
            auVar84._12_4_ = 0;
            puVar58 = puVar54 + uVar43;
            uVar81 = 0;
            do {
              auVar102._8_4_ = (int)uVar81;
              auVar102._0_8_ = uVar81;
              auVar102._12_4_ = (int)(uVar81 >> 0x20);
              auVar104 = auVar84 | auVar32;
              auVar106 = (auVar102 | auVar31) ^ auVar32;
              iVar42 = auVar104._0_4_;
              iVar119 = -(uint)(iVar42 < auVar106._0_4_);
              iVar45 = auVar104._4_4_;
              auVar108._4_4_ = -(uint)(iVar45 < auVar106._4_4_);
              iVar47 = auVar104._8_4_;
              iVar123 = -(uint)(iVar47 < auVar106._8_4_);
              iVar75 = auVar104._12_4_;
              auVar108._12_4_ = -(uint)(iVar75 < auVar106._12_4_);
              auVar85._4_4_ = iVar119;
              auVar85._0_4_ = iVar119;
              auVar85._8_4_ = iVar123;
              auVar85._12_4_ = iVar123;
              auVar85 = pshuflw(in_XMM1,auVar85,0xe8);
              auVar107._4_4_ = -(uint)(auVar106._4_4_ == iVar45);
              auVar107._12_4_ = -(uint)(auVar106._12_4_ == iVar75);
              auVar107._0_4_ = auVar107._4_4_;
              auVar107._8_4_ = auVar107._12_4_;
              auVar94 = pshuflw(in_XMM2,auVar107,0xe8);
              auVar108._0_4_ = auVar108._4_4_;
              auVar108._8_4_ = auVar108._12_4_;
              auVar106 = pshuflw(auVar85,auVar108,0xe8);
              auVar104._8_4_ = 0xffffffff;
              auVar104._0_8_ = 0xffffffffffffffff;
              auVar104._12_4_ = 0xffffffff;
              auVar104 = (auVar106 | auVar94 & auVar85) ^ auVar104;
              auVar104 = packssdw(auVar104,auVar104);
              if ((auVar104 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *puVar58 = 0xff;
              }
              auVar94._4_4_ = iVar119;
              auVar94._0_4_ = iVar119;
              auVar94._8_4_ = iVar123;
              auVar94._12_4_ = iVar123;
              auVar108 = auVar107 & auVar94 | auVar108;
              auVar104 = packssdw(auVar108,auVar108);
              auVar106._8_4_ = 0xffffffff;
              auVar106._0_8_ = 0xffffffffffffffff;
              auVar106._12_4_ = 0xffffffff;
              auVar104 = packssdw(auVar104 ^ auVar106,auVar104 ^ auVar106);
              auVar104 = packsswb(auVar104,auVar104);
              if ((auVar104._0_4_ >> 8 & 1) != 0) {
                puVar58[-4] = 0xff;
              }
              auVar104 = (auVar102 | auVar124) ^ auVar32;
              auVar95._0_4_ = -(uint)(iVar42 < auVar104._0_4_);
              auVar95._4_4_ = -(uint)(iVar45 < auVar104._4_4_);
              auVar95._8_4_ = -(uint)(iVar47 < auVar104._8_4_);
              auVar95._12_4_ = -(uint)(iVar75 < auVar104._12_4_);
              auVar109._4_4_ = auVar95._0_4_;
              auVar109._0_4_ = auVar95._0_4_;
              auVar109._8_4_ = auVar95._8_4_;
              auVar109._12_4_ = auVar95._8_4_;
              iVar119 = -(uint)(auVar104._4_4_ == iVar45);
              iVar123 = -(uint)(auVar104._12_4_ == iVar75);
              auVar18._4_4_ = iVar119;
              auVar18._0_4_ = iVar119;
              auVar18._8_4_ = iVar123;
              auVar18._12_4_ = iVar123;
              auVar120._4_4_ = auVar95._4_4_;
              auVar120._0_4_ = auVar95._4_4_;
              auVar120._8_4_ = auVar95._12_4_;
              auVar120._12_4_ = auVar95._12_4_;
              auVar104 = auVar18 & auVar109 | auVar120;
              auVar104 = packssdw(auVar104,auVar104);
              auVar9._8_4_ = 0xffffffff;
              auVar9._0_8_ = 0xffffffffffffffff;
              auVar9._12_4_ = 0xffffffff;
              auVar104 = packssdw(auVar104 ^ auVar9,auVar104 ^ auVar9);
              auVar104 = packsswb(auVar104,auVar104);
              if ((auVar104._0_4_ >> 0x10 & 1) != 0) {
                puVar58[-8] = 0xff;
              }
              auVar104 = pshufhw(auVar104,auVar109,0x84);
              auVar19._4_4_ = iVar119;
              auVar19._0_4_ = iVar119;
              auVar19._8_4_ = iVar123;
              auVar19._12_4_ = iVar123;
              auVar106 = pshufhw(auVar95,auVar19,0x84);
              auVar85 = pshufhw(auVar104,auVar120,0x84);
              auVar86._8_4_ = 0xffffffff;
              auVar86._0_8_ = 0xffffffffffffffff;
              auVar86._12_4_ = 0xffffffff;
              auVar86 = (auVar85 | auVar106 & auVar104) ^ auVar86;
              auVar104 = packssdw(auVar86,auVar86);
              auVar104 = packsswb(auVar104,auVar104);
              if ((auVar104._0_4_ >> 0x18 & 1) != 0) {
                puVar58[-0xc] = 0xff;
              }
              auVar104 = (auVar102 | auVar36) ^ auVar32;
              auVar96._0_4_ = -(uint)(iVar42 < auVar104._0_4_);
              auVar96._4_4_ = -(uint)(iVar45 < auVar104._4_4_);
              auVar96._8_4_ = -(uint)(iVar47 < auVar104._8_4_);
              auVar96._12_4_ = -(uint)(iVar75 < auVar104._12_4_);
              auVar20._4_4_ = auVar96._0_4_;
              auVar20._0_4_ = auVar96._0_4_;
              auVar20._8_4_ = auVar96._8_4_;
              auVar20._12_4_ = auVar96._8_4_;
              auVar106 = pshuflw(auVar120,auVar20,0xe8);
              auVar87._0_4_ = -(uint)(auVar104._0_4_ == iVar42);
              auVar87._4_4_ = -(uint)(auVar104._4_4_ == iVar45);
              auVar87._8_4_ = -(uint)(auVar104._8_4_ == iVar47);
              auVar87._12_4_ = -(uint)(auVar104._12_4_ == iVar75);
              auVar110._4_4_ = auVar87._4_4_;
              auVar110._0_4_ = auVar87._4_4_;
              auVar110._8_4_ = auVar87._12_4_;
              auVar110._12_4_ = auVar87._12_4_;
              auVar104 = pshuflw(auVar87,auVar110,0xe8);
              auVar111._4_4_ = auVar96._4_4_;
              auVar111._0_4_ = auVar96._4_4_;
              auVar111._8_4_ = auVar96._12_4_;
              auVar111._12_4_ = auVar96._12_4_;
              auVar85 = pshuflw(auVar96,auVar111,0xe8);
              auVar10._8_4_ = 0xffffffff;
              auVar10._0_8_ = 0xffffffffffffffff;
              auVar10._12_4_ = 0xffffffff;
              auVar104 = packssdw(auVar104 & auVar106,(auVar85 | auVar104 & auVar106) ^ auVar10);
              auVar104 = packsswb(auVar104,auVar104);
              if ((auVar104 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar58[-0x10] = 0xff;
              }
              auVar21._4_4_ = auVar96._0_4_;
              auVar21._0_4_ = auVar96._0_4_;
              auVar21._8_4_ = auVar96._8_4_;
              auVar21._12_4_ = auVar96._8_4_;
              auVar111 = auVar110 & auVar21 | auVar111;
              auVar85 = packssdw(auVar111,auVar111);
              auVar11._8_4_ = 0xffffffff;
              auVar11._0_8_ = 0xffffffffffffffff;
              auVar11._12_4_ = 0xffffffff;
              auVar104 = packssdw(auVar104,auVar85 ^ auVar11);
              auVar104 = packsswb(auVar104,auVar104);
              if ((auVar104._4_2_ >> 8 & 1) != 0) {
                puVar58[-0x14] = 0xff;
              }
              auVar104 = (auVar102 | auVar35) ^ auVar32;
              auVar97._0_4_ = -(uint)(iVar42 < auVar104._0_4_);
              auVar97._4_4_ = -(uint)(iVar45 < auVar104._4_4_);
              auVar97._8_4_ = -(uint)(iVar47 < auVar104._8_4_);
              auVar97._12_4_ = -(uint)(iVar75 < auVar104._12_4_);
              auVar112._4_4_ = auVar97._0_4_;
              auVar112._0_4_ = auVar97._0_4_;
              auVar112._8_4_ = auVar97._8_4_;
              auVar112._12_4_ = auVar97._8_4_;
              iVar119 = -(uint)(auVar104._4_4_ == iVar45);
              iVar123 = -(uint)(auVar104._12_4_ == iVar75);
              auVar22._4_4_ = iVar119;
              auVar22._0_4_ = iVar119;
              auVar22._8_4_ = iVar123;
              auVar22._12_4_ = iVar123;
              auVar121._4_4_ = auVar97._4_4_;
              auVar121._0_4_ = auVar97._4_4_;
              auVar121._8_4_ = auVar97._12_4_;
              auVar121._12_4_ = auVar97._12_4_;
              auVar104 = auVar22 & auVar112 | auVar121;
              auVar104 = packssdw(auVar104,auVar104);
              auVar12._8_4_ = 0xffffffff;
              auVar12._0_8_ = 0xffffffffffffffff;
              auVar12._12_4_ = 0xffffffff;
              auVar104 = packssdw(auVar104 ^ auVar12,auVar104 ^ auVar12);
              auVar104 = packsswb(auVar104,auVar104);
              if ((auVar104 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar58[-0x18] = 0xff;
              }
              auVar104 = pshufhw(auVar104,auVar112,0x84);
              auVar23._4_4_ = iVar119;
              auVar23._0_4_ = iVar119;
              auVar23._8_4_ = iVar123;
              auVar23._12_4_ = iVar123;
              auVar106 = pshufhw(auVar97,auVar23,0x84);
              auVar85 = pshufhw(auVar104,auVar121,0x84);
              auVar88._8_4_ = 0xffffffff;
              auVar88._0_8_ = 0xffffffffffffffff;
              auVar88._12_4_ = 0xffffffff;
              auVar88 = (auVar85 | auVar106 & auVar104) ^ auVar88;
              auVar104 = packssdw(auVar88,auVar88);
              auVar104 = packsswb(auVar104,auVar104);
              if ((auVar104._6_2_ >> 8 & 1) != 0) {
                puVar58[-0x1c] = 0xff;
              }
              auVar104 = (auVar102 | auVar34) ^ auVar32;
              auVar98._0_4_ = -(uint)(iVar42 < auVar104._0_4_);
              auVar98._4_4_ = -(uint)(iVar45 < auVar104._4_4_);
              auVar98._8_4_ = -(uint)(iVar47 < auVar104._8_4_);
              auVar98._12_4_ = -(uint)(iVar75 < auVar104._12_4_);
              auVar24._4_4_ = auVar98._0_4_;
              auVar24._0_4_ = auVar98._0_4_;
              auVar24._8_4_ = auVar98._8_4_;
              auVar24._12_4_ = auVar98._8_4_;
              auVar106 = pshuflw(auVar121,auVar24,0xe8);
              auVar89._0_4_ = -(uint)(auVar104._0_4_ == iVar42);
              auVar89._4_4_ = -(uint)(auVar104._4_4_ == iVar45);
              auVar89._8_4_ = -(uint)(auVar104._8_4_ == iVar47);
              auVar89._12_4_ = -(uint)(auVar104._12_4_ == iVar75);
              auVar113._4_4_ = auVar89._4_4_;
              auVar113._0_4_ = auVar89._4_4_;
              auVar113._8_4_ = auVar89._12_4_;
              auVar113._12_4_ = auVar89._12_4_;
              auVar104 = pshuflw(auVar89,auVar113,0xe8);
              auVar114._4_4_ = auVar98._4_4_;
              auVar114._0_4_ = auVar98._4_4_;
              auVar114._8_4_ = auVar98._12_4_;
              auVar114._12_4_ = auVar98._12_4_;
              auVar85 = pshuflw(auVar98,auVar114,0xe8);
              auVar99._8_4_ = 0xffffffff;
              auVar99._0_8_ = 0xffffffffffffffff;
              auVar99._12_4_ = 0xffffffff;
              auVar99 = (auVar85 | auVar104 & auVar106) ^ auVar99;
              auVar85 = packssdw(auVar99,auVar99);
              auVar104 = packsswb(auVar104 & auVar106,auVar85);
              if ((auVar104 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar58[-0x20] = 0xff;
              }
              auVar25._4_4_ = auVar98._0_4_;
              auVar25._0_4_ = auVar98._0_4_;
              auVar25._8_4_ = auVar98._8_4_;
              auVar25._12_4_ = auVar98._8_4_;
              auVar114 = auVar113 & auVar25 | auVar114;
              auVar85 = packssdw(auVar114,auVar114);
              auVar13._8_4_ = 0xffffffff;
              auVar13._0_8_ = 0xffffffffffffffff;
              auVar13._12_4_ = 0xffffffff;
              auVar85 = packssdw(auVar85 ^ auVar13,auVar85 ^ auVar13);
              auVar104 = packsswb(auVar104,auVar85);
              if ((auVar104._8_2_ >> 8 & 1) != 0) {
                puVar58[-0x24] = 0xff;
              }
              auVar104 = (auVar102 | auVar33) ^ auVar32;
              auVar100._0_4_ = -(uint)(iVar42 < auVar104._0_4_);
              auVar100._4_4_ = -(uint)(iVar45 < auVar104._4_4_);
              auVar100._8_4_ = -(uint)(iVar47 < auVar104._8_4_);
              auVar100._12_4_ = -(uint)(iVar75 < auVar104._12_4_);
              auVar115._4_4_ = auVar100._0_4_;
              auVar115._0_4_ = auVar100._0_4_;
              auVar115._8_4_ = auVar100._8_4_;
              auVar115._12_4_ = auVar100._8_4_;
              iVar119 = -(uint)(auVar104._4_4_ == iVar45);
              iVar123 = -(uint)(auVar104._12_4_ == iVar75);
              auVar26._4_4_ = iVar119;
              auVar26._0_4_ = iVar119;
              auVar26._8_4_ = iVar123;
              auVar26._12_4_ = iVar123;
              auVar122._4_4_ = auVar100._4_4_;
              auVar122._0_4_ = auVar100._4_4_;
              auVar122._8_4_ = auVar100._12_4_;
              auVar122._12_4_ = auVar100._12_4_;
              auVar104 = auVar26 & auVar115 | auVar122;
              auVar104 = packssdw(auVar104,auVar104);
              auVar14._8_4_ = 0xffffffff;
              auVar14._0_8_ = 0xffffffffffffffff;
              auVar14._12_4_ = 0xffffffff;
              auVar104 = packssdw(auVar104 ^ auVar14,auVar104 ^ auVar14);
              auVar104 = packsswb(auVar104,auVar104);
              if ((auVar104 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar58[-0x28] = 0xff;
              }
              auVar104 = pshufhw(auVar104,auVar115,0x84);
              auVar27._4_4_ = iVar119;
              auVar27._0_4_ = iVar119;
              auVar27._8_4_ = iVar123;
              auVar27._12_4_ = iVar123;
              auVar106 = pshufhw(auVar100,auVar27,0x84);
              auVar85 = pshufhw(auVar104,auVar122,0x84);
              auVar90._8_4_ = 0xffffffff;
              auVar90._0_8_ = 0xffffffffffffffff;
              auVar90._12_4_ = 0xffffffff;
              auVar90 = (auVar85 | auVar106 & auVar104) ^ auVar90;
              auVar104 = packssdw(auVar90,auVar90);
              auVar104 = packsswb(auVar104,auVar104);
              if ((auVar104._10_2_ >> 8 & 1) != 0) {
                puVar58[-0x2c] = 0xff;
              }
              auVar104 = (auVar102 | _DAT_005aa840) ^ auVar32;
              auVar101._0_4_ = -(uint)(iVar42 < auVar104._0_4_);
              auVar101._4_4_ = -(uint)(iVar45 < auVar104._4_4_);
              auVar101._8_4_ = -(uint)(iVar47 < auVar104._8_4_);
              auVar101._12_4_ = -(uint)(iVar75 < auVar104._12_4_);
              auVar28._4_4_ = auVar101._0_4_;
              auVar28._0_4_ = auVar101._0_4_;
              auVar28._8_4_ = auVar101._8_4_;
              auVar28._12_4_ = auVar101._8_4_;
              auVar106 = pshuflw(auVar122,auVar28,0xe8);
              auVar91._0_4_ = -(uint)(auVar104._0_4_ == iVar42);
              auVar91._4_4_ = -(uint)(auVar104._4_4_ == iVar45);
              auVar91._8_4_ = -(uint)(auVar104._8_4_ == iVar47);
              auVar91._12_4_ = -(uint)(auVar104._12_4_ == iVar75);
              auVar116._4_4_ = auVar91._4_4_;
              auVar116._0_4_ = auVar91._4_4_;
              auVar116._8_4_ = auVar91._12_4_;
              auVar116._12_4_ = auVar91._12_4_;
              auVar104 = pshuflw(auVar91,auVar116,0xe8);
              auVar117._4_4_ = auVar101._4_4_;
              auVar117._0_4_ = auVar101._4_4_;
              auVar117._8_4_ = auVar101._12_4_;
              auVar117._12_4_ = auVar101._12_4_;
              auVar85 = pshuflw(auVar101,auVar117,0xe8);
              auVar15._8_4_ = 0xffffffff;
              auVar15._0_8_ = 0xffffffffffffffff;
              auVar15._12_4_ = 0xffffffff;
              auVar104 = packssdw(auVar104 & auVar106,(auVar85 | auVar104 & auVar106) ^ auVar15);
              auVar104 = packsswb(auVar104,auVar104);
              if ((auVar104 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar58[-0x30] = 0xff;
              }
              auVar29._4_4_ = auVar101._0_4_;
              auVar29._0_4_ = auVar101._0_4_;
              auVar29._8_4_ = auVar101._8_4_;
              auVar29._12_4_ = auVar101._8_4_;
              auVar117 = auVar116 & auVar29 | auVar117;
              auVar85 = packssdw(auVar117,auVar117);
              auVar16._8_4_ = 0xffffffff;
              auVar16._0_8_ = 0xffffffffffffffff;
              auVar16._12_4_ = 0xffffffff;
              auVar104 = packssdw(auVar104,auVar85 ^ auVar16);
              auVar104 = packsswb(auVar104,auVar104);
              if ((auVar104._12_2_ >> 8 & 1) != 0) {
                puVar58[-0x34] = 0xff;
              }
              auVar104 = (auVar102 | _DAT_005aa830) ^ auVar32;
              auVar92._0_4_ = -(uint)(iVar42 < auVar104._0_4_);
              auVar92._4_4_ = -(uint)(iVar45 < auVar104._4_4_);
              auVar92._8_4_ = -(uint)(iVar47 < auVar104._8_4_);
              auVar92._12_4_ = -(uint)(iVar75 < auVar104._12_4_);
              auVar118._4_4_ = auVar92._0_4_;
              auVar118._0_4_ = auVar92._0_4_;
              auVar118._8_4_ = auVar92._8_4_;
              auVar118._12_4_ = auVar92._8_4_;
              auVar103._4_4_ = -(uint)(auVar104._4_4_ == iVar45);
              auVar103._12_4_ = -(uint)(auVar104._12_4_ == iVar75);
              auVar103._0_4_ = auVar103._4_4_;
              auVar103._8_4_ = auVar103._12_4_;
              auVar105._4_4_ = auVar92._4_4_;
              auVar105._0_4_ = auVar92._4_4_;
              auVar105._8_4_ = auVar92._12_4_;
              auVar105._12_4_ = auVar92._12_4_;
              auVar85 = auVar103 & auVar118 | auVar105;
              auVar104 = packssdw(auVar92,auVar85);
              auVar17._8_4_ = 0xffffffff;
              auVar17._0_8_ = 0xffffffffffffffff;
              auVar17._12_4_ = 0xffffffff;
              auVar104 = packssdw(auVar104 ^ auVar17,auVar104 ^ auVar17);
              auVar104 = packsswb(auVar104,auVar104);
              if ((auVar104 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar58[-0x38] = 0xff;
              }
              auVar104 = pshufhw(auVar104,auVar118,0x84);
              in_XMM2 = pshufhw(auVar85,auVar103,0x84);
              in_XMM2 = in_XMM2 & auVar104;
              auVar104 = pshufhw(auVar104,auVar105,0x84);
              auVar93._8_4_ = 0xffffffff;
              auVar93._0_8_ = 0xffffffffffffffff;
              auVar93._12_4_ = 0xffffffff;
              auVar93 = (auVar104 | in_XMM2) ^ auVar93;
              auVar104 = packssdw(auVar93,auVar93);
              in_XMM1 = packsswb(auVar104,auVar104);
              if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                puVar58[-0x3c] = 0xff;
              }
              uVar81 = uVar81 + 0x10;
              puVar58 = puVar58 + -0x40;
            } while ((uVar64 + 0x10 & 0x3ffffff0) != uVar81);
          }
          if (0 < (int)local_45c) {
            uVar43 = (int)s->img_y >> 1;
            if (0 < (int)uVar43) {
              uVar68 = s->img_x * iVar46;
              uVar64 = (s->img_y - 1) * uVar68;
              uVar81 = 0;
              uVar72 = 0;
              do {
                if (0 < (int)uVar68) {
                  uVar76 = 0;
                  do {
                    uVar41 = puVar54[uVar76 + uVar81];
                    puVar54[uVar76 + uVar81] = puVar54[uVar76 + uVar64];
                    puVar54[uVar76 + uVar64] = uVar41;
                    uVar76 = uVar76 + 1;
                  } while (uVar68 != uVar76);
                }
                uVar72 = uVar72 + 1;
                uVar64 = uVar64 - uVar68;
                uVar81 = (ulong)((int)uVar81 + uVar68);
              } while (uVar72 != uVar43);
            }
          }
          if ((iVar46 != req_comp && req_comp != 0) &&
             (puVar54 = stbi__convert_format(puVar54,iVar46,req_comp,s->img_x,s->img_y),
             puVar54 == (uchar *)0x0)) {
            return (void *)0x0;
          }
          *local_480 = s->img_x;
          *local_478 = s->img_y;
          if (comp != (int *)0x0) {
            *comp = s->img_n;
            return puVar54;
          }
          return puVar54;
        }
      }
    }
  }
  else if (s->read_from_callbacks != 0) {
    stbi__refill_buffer(s);
    psVar67 = s->img_buffer;
    goto LAB_0016f285;
  }
LAB_0016f3f9:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  psVar52 = (stbi__jpeg *)malloc(0x4888);
  if (psVar52 == (stbi__jpeg *)0x0) {
    stbi__g_failure_reason = "outofmem";
  }
  else {
    local_480 = (uint *)x;
    local_478 = (stbi__uint32 *)y;
    memset(psVar52,0,0x4888);
    psVar52->s = s;
    psVar52->idct_block_kernel = stbi__idct_simd;
    psVar52->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar52->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    psVar52->jfif = 0;
    psVar52->app14_color_transform = -1;
    psVar52->marker = 0xff;
    sVar39 = stbi__get_marker(psVar52);
    if (sVar39 == 0xd8) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      free(psVar52);
      psVar52 = (stbi__jpeg *)malloc(0x4888);
      if (psVar52 == (stbi__jpeg *)0x0) goto LAB_00170ee6;
      memset(psVar52,0,0x4888);
      psVar52->s = s;
      psVar52->idct_block_kernel = stbi__idct_simd;
      psVar52->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
      psVar52->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
      s->img_n = 0;
      if ((uint)req_comp < 5) {
        paVar2 = psVar52->img_comp;
        lVar71 = 0x46d8;
        do {
          psVar67 = psVar52->huff_dc[0].fast + lVar71 + -8;
          psVar67[0] = '\0';
          psVar67[1] = '\0';
          psVar67[2] = '\0';
          psVar67[3] = '\0';
          psVar67[4] = '\0';
          psVar67[5] = '\0';
          psVar67[6] = '\0';
          psVar67[7] = '\0';
          psVar67[8] = '\0';
          psVar67[9] = '\0';
          psVar67[10] = '\0';
          psVar67[0xb] = '\0';
          psVar67[0xc] = '\0';
          psVar67[0xd] = '\0';
          psVar67[0xe] = '\0';
          psVar67[0xf] = '\0';
          lVar71 = lVar71 + 0x60;
        } while (lVar71 != 0x4858);
        psVar52->restart_interval = 0;
        iVar42 = stbi__decode_jpeg_header(psVar52,0);
        uVar43 = extraout_EDX;
        if (iVar42 == 0) {
LAB_0017194c:
          uVar64 = psVar52->s->img_n;
        }
        else {
          bVar40 = stbi__get_marker(psVar52);
          uVar64 = (uint)bVar40;
          local_488 = psVar52->huff_ac[0].delta + 9;
          uVar65 = extraout_RDX;
LAB_0016f861:
          uVar43 = (uint)uVar65;
          if (uVar64 == 0xda) {
            iVar42 = stbi__get16be(psVar52->s);
            psVar77 = psVar52->s;
            pbVar62 = psVar77->img_buffer;
            paVar66 = extraout_RDX_03;
            if (pbVar62 < psVar77->img_buffer_end) {
LAB_0016f929:
              psVar77->img_buffer = pbVar62 + 1;
              bVar40 = *pbVar62;
            }
            else {
              if (psVar77->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar77);
                pbVar62 = psVar77->img_buffer;
                paVar66 = extraout_RDX_04;
                goto LAB_0016f929;
              }
              bVar40 = 0;
            }
            psVar52->scan_n = (uint)bVar40;
            if (((byte)(bVar40 - 5) < 0xfc) || (psVar52->s->img_n < (int)(uint)bVar40)) {
              stbi__g_failure_reason = "bad SOS component count";
            }
            else {
              if (iVar42 == (uint)bVar40 * 2 + 6) {
                if (bVar40 != 0) {
                  lVar71 = 0;
                  do {
                    psVar77 = psVar52->s;
                    pbVar62 = psVar77->img_buffer;
                    if (pbVar62 < psVar77->img_buffer_end) {
LAB_0016f9a3:
                      psVar77->img_buffer = pbVar62 + 1;
                      uVar64 = (uint)*pbVar62;
                    }
                    else {
                      if (psVar77->read_from_callbacks != 0) {
                        stbi__refill_buffer(psVar77);
                        pbVar62 = psVar77->img_buffer;
                        goto LAB_0016f9a3;
                      }
                      uVar64 = 0;
                    }
                    psVar77 = psVar52->s;
                    pbVar62 = psVar77->img_buffer;
                    if (pbVar62 < psVar77->img_buffer_end) {
LAB_0016f9e2:
                      psVar77->img_buffer = pbVar62 + 1;
                      bVar40 = *pbVar62;
                    }
                    else {
                      if (psVar77->read_from_callbacks != 0) {
                        stbi__refill_buffer(psVar77);
                        pbVar62 = psVar77->img_buffer;
                        goto LAB_0016f9e2;
                      }
                      bVar40 = 0;
                    }
                    uVar43 = psVar52->s->img_n;
                    if ((int)uVar43 < 1) {
                      uVar81 = 0;
                    }
                    else {
                      uVar81 = 0;
                      paVar66 = paVar2;
                      do {
                        if (paVar66->id == uVar64) goto LAB_0016fa14;
                        uVar81 = uVar81 + 1;
                        paVar66 = paVar66 + 1;
                      } while (uVar43 != uVar81);
                      uVar81 = (ulong)uVar43;
                    }
LAB_0016fa14:
                    if ((uint)uVar81 == uVar43) goto LAB_0017194c;
                    uVar72 = uVar81 & 0xffffffff;
                    paVar66 = (anon_struct_96_18_0d0905d3 *)(uVar72 * 0x60);
                    psVar52->img_comp[uVar72].hd = (uint)(bVar40 >> 4);
                    if (0x3f < bVar40) {
                      stbi__g_failure_reason = "bad DC huff";
                      goto LAB_00171945;
                    }
                    paVar66 = paVar2 + uVar72;
                    paVar66->ha = bVar40 & 0xf;
                    if (3 < (bVar40 & 0xf)) {
                      stbi__g_failure_reason = "bad AC huff";
                      goto LAB_00171945;
                    }
                    psVar52->order[lVar71] = (uint)uVar81;
                    lVar71 = lVar71 + 1;
                  } while (lVar71 < psVar52->scan_n);
                }
                psVar77 = psVar52->s;
                pbVar62 = psVar77->img_buffer;
                if (pbVar62 < psVar77->img_buffer_end) {
LAB_0016fac7:
                  psVar77->img_buffer = pbVar62 + 1;
                  uVar43 = (uint)*pbVar62;
                }
                else {
                  if (psVar77->read_from_callbacks != 0) {
                    stbi__refill_buffer(psVar77);
                    pbVar62 = psVar77->img_buffer;
                    goto LAB_0016fac7;
                  }
                  uVar43 = 0;
                }
                psVar52->spec_start = uVar43;
                psVar77 = psVar52->s;
                pbVar62 = psVar77->img_buffer;
                if (pbVar62 < psVar77->img_buffer_end) {
LAB_0016fb0d:
                  psVar77->img_buffer = pbVar62 + 1;
                  uVar43 = (uint)*pbVar62;
                }
                else {
                  if (psVar77->read_from_callbacks != 0) {
                    stbi__refill_buffer(psVar77);
                    pbVar62 = psVar77->img_buffer;
                    goto LAB_0016fb0d;
                  }
                  uVar43 = 0;
                }
                psVar52->spec_end = uVar43;
                psVar77 = psVar52->s;
                pbVar62 = psVar77->img_buffer;
                if (pbVar62 < psVar77->img_buffer_end) {
LAB_0016fb53:
                  psVar77->img_buffer = pbVar62 + 1;
                  bVar40 = *pbVar62;
                }
                else {
                  if (psVar77->read_from_callbacks != 0) {
                    stbi__refill_buffer(psVar77);
                    pbVar62 = psVar77->img_buffer;
                    goto LAB_0016fb53;
                  }
                  bVar40 = 0;
                }
                psVar52->succ_high = (uint)(bVar40 >> 4);
                uVar43 = bVar40 & 0xf;
                paVar66 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar43;
                psVar52->succ_low = uVar43;
                iVar42 = psVar52->progressive;
                iVar46 = psVar52->spec_start;
                if (iVar42 == 0) {
                  if (((iVar46 != 0) || (0xf < bVar40)) || ((bVar40 & 0xf) != 0)) goto LAB_00170f76;
                  psVar52->spec_end = 0x3f;
                }
                else if (((0x3f < iVar46) || (0x3f < psVar52->spec_end)) ||
                        ((psVar52->spec_end < iVar46 || ((0xdf < bVar40 || (0xd < uVar43)))))) {
LAB_00170f76:
                  stbi__g_failure_reason = "bad SOS";
                  goto LAB_00171945;
                }
                iVar46 = psVar52->scan_n;
                uVar81 = (ulong)(uint)psVar52->restart_interval;
                if (psVar52->restart_interval == 0) {
                  uVar81 = 0x7fffffff;
                }
                psVar52->code_buffer = 0;
                psVar52->code_bits = 0;
                psVar52->nomore = 0;
                psVar52->img_comp[3].dc_pred = 0;
                psVar52->img_comp[2].dc_pred = 0;
                psVar52->img_comp[1].dc_pred = 0;
                psVar52->img_comp[0].dc_pred = 0;
                psVar52->marker = 0xff;
                uVar43 = (uint)uVar81;
                psVar52->todo = uVar43;
                psVar52->eob_run = 0;
                if (iVar42 == 0) {
                  if (iVar46 == 1) {
                    iVar42 = psVar52->order[0];
                    iVar46 = psVar52->img_comp[iVar42].y + 7 >> 3;
                    uVar72 = 1;
                    if (0 < iVar46) {
                      uVar64 = paVar2[iVar42].x + 7 >> 3;
                      local_520 = (ulong)uVar64;
                      iVar47 = 0;
                      iVar45 = 0;
                      do {
                        if (0 < (int)uVar64) {
                          lVar71 = 0;
                          do {
                            iVar75 = stbi__jpeg_decode_block
                                               (psVar52,(short *)&local_438,
                                                (stbi__huffman *)
                                                psVar52->huff_dc[paVar2[iVar42].hd].fast,
                                                (stbi__huffman *)
                                                psVar52->huff_ac[paVar2[iVar42].ha].fast,
                                                psVar52->fast_ac[paVar2[iVar42].ha],iVar42,
                                                psVar52->dequant[paVar2[iVar42].tq]);
                            if (iVar75 == 0) {
                              bVar83 = false;
                              local_508 = 0;
                              uVar81 = extraout_RDX_07;
                            }
                            else {
                              (*psVar52->idct_block_kernel)
                                        (paVar2[iVar42].data + lVar71 + iVar47 * paVar2[iVar42].w2,
                                         paVar2[iVar42].w2,(short *)&local_438);
                              iVar75 = psVar52->todo;
                              psVar52->todo = iVar75 + -1;
                              bVar83 = true;
                              uVar81 = extraout_RDX_08;
                              if (iVar75 < 2) {
                                if (psVar52->code_bits < 0x18) {
                                  stbi__grow_buffer_unsafe(psVar52);
                                  uVar81 = extraout_RDX_09;
                                }
                                if ((psVar52->marker & 0xf8) == 0xd0) {
                                  psVar52->code_buffer = 0;
                                  psVar52->code_bits = 0;
                                  psVar52->nomore = 0;
                                  psVar52->img_comp[3].dc_pred = 0;
                                  psVar52->img_comp[2].dc_pred = 0;
                                  psVar52->img_comp[1].dc_pred = 0;
                                  psVar52->img_comp[0].dc_pred = 0;
                                  psVar52->marker = 0xff;
                                  iVar75 = psVar52->restart_interval;
                                  uVar81 = 0x7fffffff;
                                  if (iVar75 == 0) {
                                    iVar75 = 0x7fffffff;
                                  }
                                  psVar52->todo = iVar75;
                                  psVar52->eob_run = 0;
                                }
                                else {
                                  local_508 = 1;
                                  bVar83 = false;
                                }
                              }
                            }
                            uVar43 = (uint)uVar81;
                            if (!bVar83) {
                              uVar72 = local_508 & 0xffffffff;
                              goto LAB_00170bbb;
                            }
                            lVar71 = lVar71 + 8;
                          } while (local_520 * 8 - lVar71 != 0);
                        }
                        uVar43 = (uint)uVar81;
                        iVar45 = iVar45 + 1;
                        iVar47 = iVar47 + 8;
                      } while (iVar45 != iVar46);
                      goto LAB_0017093e;
                    }
                  }
                  else {
                    uVar72 = 1;
                    if (0 < psVar52->img_mcu_y) {
                      local_520 = 0;
                      do {
                        if (0 < psVar52->img_mcu_x) {
                          iVar42 = 0;
                          do {
                            if (0 < psVar52->scan_n) {
                              lVar71 = 0;
                              do {
                                iVar46 = psVar52->order[lVar71];
                                local_508 = (ulong)iVar46;
                                local_4b0 = lVar71;
                                if (0 < psVar52->img_comp[local_508].v) {
                                  iVar45 = 0;
                                  bVar83 = true;
                                  do {
                                    iVar47 = paVar2[local_508].h;
                                    if (0 < iVar47) {
                                      iVar75 = 0;
                                      do {
                                        iVar119 = paVar2[local_508].v;
                                        iVar123 = stbi__jpeg_decode_block
                                                            (psVar52,(short *)&local_438,
                                                             (stbi__huffman *)
                                                             psVar52->huff_dc[paVar2[local_508].hd].
                                                             fast,(stbi__huffman *)
                                                                  psVar52->huff_ac
                                                                  [paVar2[local_508].ha].fast,
                                                             psVar52->fast_ac[paVar2[local_508].ha],
                                                             iVar46,psVar52->dequant
                                                                    [paVar2[local_508].tq]);
                                        uVar43 = (uint)extraout_RDX_11;
                                        if (iVar123 == 0) {
                                          uVar81 = extraout_RDX_11;
                                          if (!bVar83) goto LAB_00170abe;
                                          goto LAB_00170ba8;
                                        }
                                        (*psVar52->idct_block_kernel)
                                                  (paVar2[local_508].data +
                                                   (long)((iVar47 * iVar42 + iVar75) * 8) +
                                                   (long)(int)((iVar119 * (uint)local_520 + iVar45)
                                                               * paVar2[local_508].w2 * 8),
                                                   paVar2[local_508].w2,(short *)&local_438);
                                        iVar75 = iVar75 + 1;
                                        iVar47 = paVar2[local_508].h;
                                        uVar81 = extraout_RDX_12;
                                      } while (iVar75 < iVar47);
                                    }
                                    iVar45 = iVar45 + 1;
                                    bVar83 = iVar45 < paVar2[local_508].v;
                                  } while (iVar45 < paVar2[local_508].v);
                                }
LAB_00170abe:
                                lVar71 = local_4b0 + 1;
                              } while (lVar71 < psVar52->scan_n);
                            }
                            uVar43 = (uint)uVar81;
                            iVar46 = psVar52->todo;
                            psVar52->todo = iVar46 + -1;
                            uVar72 = 1;
                            if (iVar46 < 2) {
                              if (psVar52->code_bits < 0x18) {
                                stbi__grow_buffer_unsafe(psVar52);
                                uVar43 = extraout_EDX_02;
                              }
                              if ((psVar52->marker & 0xf8) != 0xd0) goto LAB_00170bbb;
                              psVar52->code_buffer = 0;
                              psVar52->code_bits = 0;
                              psVar52->nomore = 0;
                              psVar52->img_comp[3].dc_pred = 0;
                              psVar52->img_comp[2].dc_pred = 0;
                              psVar52->img_comp[1].dc_pred = 0;
                              psVar52->img_comp[0].dc_pred = 0;
                              psVar52->marker = 0xff;
                              iVar46 = psVar52->restart_interval;
                              uVar81 = 0x7fffffff;
                              if (iVar46 == 0) {
                                iVar46 = 0x7fffffff;
                              }
                              psVar52->todo = iVar46;
                              psVar52->eob_run = 0;
                            }
                            iVar42 = iVar42 + 1;
                          } while (iVar42 < psVar52->img_mcu_x);
                        }
                        uVar43 = (uint)uVar81;
                        uVar72 = 1;
                        uVar64 = (uint)local_520 + 1;
                        local_520 = (ulong)uVar64;
                      } while ((int)uVar64 < psVar52->img_mcu_y);
                    }
                  }
                }
                else if (iVar46 == 1) {
                  local_468 = (long)psVar52->order[0];
                  iVar42 = psVar52->img_comp[local_468].y + 7 >> 3;
                  uVar72 = 1;
                  local_470 = CONCAT44(local_470._4_4_,iVar42);
                  if (0 < iVar42) {
                    paVar66 = paVar2 + local_468;
                    local_4b0 = CONCAT44(local_4b0._4_4_,psVar52->img_comp[local_468].x + 7 >> 3);
                    iVar42 = 0;
                    local_4a0 = paVar66;
                    do {
                      if (0 < (int)(uint)local_4b0) {
                        uVar64 = 0;
                        do {
                          piVar1 = local_488;
                          psVar79 = paVar66->coeff +
                                    (int)((paVar66->coeff_w * iVar42 + uVar64) * 0x40);
                          uVar72 = (ulong)psVar52->spec_start;
                          local_508 = (ulong)uVar64;
                          if (uVar72 == 0) {
                            iVar46 = stbi__jpeg_decode_block_prog_dc
                                               (psVar52,psVar79,
                                                (stbi__huffman *)psVar52->huff_dc[paVar66->hd].fast,
                                                (int)local_468);
                            uVar81 = extraout_RDX_05;
                            if (iVar46 != 0) goto LAB_0016fe86;
                            bVar83 = false;
                            local_520 = 0;
                          }
                          else {
                            lVar71 = (long)paVar66->ha;
                            iVar46 = psVar52->eob_run;
                            bVar40 = (byte)psVar52->succ_low;
                            if (psVar52->succ_high == 0) {
                              if (iVar46 == 0) {
                                do {
                                  if (psVar52->code_bits < 0x10) {
                                    stbi__grow_buffer_unsafe(psVar52);
                                  }
                                  sVar5 = psVar52->fast_ac[lVar71][psVar52->code_buffer >> 0x17];
                                  uVar43 = (uint)sVar5;
                                  iVar46 = (int)uVar72;
                                  if (sVar5 == 0) {
                                    if (psVar52->code_bits < 0x10) {
                                      stbi__grow_buffer_unsafe(psVar52);
                                    }
                                    uVar43 = psVar52->code_buffer;
                                    uVar81 = (ulong)psVar52->huff_ac[lVar71].fast[uVar43 >> 0x17];
                                    if (uVar81 == 0xff) {
                                      lVar60 = 0;
                                      do {
                                        lVar73 = lVar60;
                                        lVar60 = lVar73 + 1;
                                      } while ((uint)piVar1[lVar71 * 0x1a4 + lVar73 + -0x11] <=
                                               uVar43 >> 0x10);
                                      iVar45 = psVar52->code_bits;
                                      if (lVar60 == 8) {
                                        psVar52->code_bits = iVar45 + -0x10;
                                        uVar68 = 0xffffffff;
                                      }
                                      else {
                                        uVar68 = 0xffffffff;
                                        if (((int)(lVar73 + 10) <= iVar45) &&
                                           (uVar59 = (uVar43 >> (0x17U - (char)lVar60 & 0x1f) &
                                                     stbi__bmask[lVar73 + 10]) +
                                                     piVar1[lVar71 * 0x1a4 + lVar60], uVar59 < 0x100
                                           )) {
                                          psVar52->code_bits = (iVar45 - (int)lVar60) + -9;
                                          psVar52->code_buffer =
                                               uVar43 << ((byte)(lVar73 + 10) & 0x1f);
                                          uVar81 = (ulong)uVar59;
                                          goto LAB_00170365;
                                        }
                                      }
                                    }
                                    else {
                                      bVar4 = psVar52->huff_ac[lVar71].size[uVar81];
                                      uVar68 = 0xffffffff;
                                      if ((int)(uint)bVar4 <= psVar52->code_bits) {
                                        psVar52->code_buffer = uVar43 << (bVar4 & 0x1f);
                                        psVar52->code_bits = psVar52->code_bits - (uint)bVar4;
LAB_00170365:
                                        uVar68 = (uint)psVar52->huff_ac[lVar71].values[uVar81];
                                      }
                                    }
                                    if ((int)uVar68 < 0) goto LAB_0017048c;
                                    uVar43 = uVar68 >> 4;
                                    uVar81 = (ulong)uVar43;
                                    uVar59 = uVar68 & 0xf;
                                    if (uVar59 == 0) {
                                      if (0xef < uVar68) {
                                        uVar72 = (ulong)(iVar46 + 0x10);
                                        iVar45 = 0;
                                        bVar83 = true;
                                        goto LAB_001704a1;
                                      }
                                      psVar52->eob_run = 1 << ((byte)uVar43 & 0x1f);
                                      if (0xf < uVar68) {
                                        if (psVar52->code_bits < (int)uVar43) {
                                          local_498 = CONCAT44(local_498._4_4_,uVar43);
                                          stbi__grow_buffer_unsafe(psVar52);
                                          uVar81 = local_498 & 0xffffffff;
                                        }
                                        uVar43 = 0;
                                        if ((int)uVar81 <= psVar52->code_bits) {
                                          bVar4 = (byte)uVar81 & 0x1f;
                                          uVar43 = psVar52->code_buffer << bVar4 |
                                                   psVar52->code_buffer >> 0x20 - bVar4;
                                          uVar68 = stbi__bmask[uVar81];
                                          psVar52->code_buffer = ~uVar68 & uVar43;
                                          uVar43 = uVar43 & uVar68;
                                          psVar52->code_bits = psVar52->code_bits - (int)uVar81;
                                        }
                                        psVar52->eob_run = psVar52->eob_run + uVar43;
                                      }
                                      psVar52->eob_run = psVar52->eob_run + -1;
                                      iVar45 = 2;
                                      goto LAB_0017049f;
                                    }
                                    bVar4 = ""[(long)iVar46 + uVar81];
                                    if (psVar52->code_bits < (int)uVar59) {
                                      stbi__grow_buffer_unsafe(psVar52);
                                    }
                                    iVar45 = 0;
                                    iVar47 = 0;
                                    if ((int)uVar59 <= psVar52->code_bits) {
                                      uVar43 = psVar52->code_buffer;
                                      uVar63 = uVar43 << (sbyte)uVar59 |
                                               uVar43 >> 0x20 - (sbyte)uVar59;
                                      uVar68 = *(uint *)((long)stbi__bmask + (ulong)(uVar59 << 2));
                                      psVar52->code_buffer = ~uVar68 & uVar63;
                                      psVar52->code_bits = psVar52->code_bits - uVar59;
                                      iVar47 = 0;
                                      if (-1 < (int)uVar43) {
                                        iVar47 = *(int *)((long)stbi__jbias + (ulong)(uVar59 << 2));
                                      }
                                      iVar47 = (uVar63 & uVar68) + iVar47;
                                    }
                                    uVar72 = (ulong)((int)((long)iVar46 + uVar81) + 1);
                                    psVar79[bVar4] = (short)(iVar47 << (bVar40 & 0x1f));
                                    bVar83 = true;
                                  }
                                  else {
                                    uVar59 = iVar46 + (uVar43 >> 4 & 0xf);
                                    uVar72 = (ulong)uVar59;
                                    uVar68 = uVar43 & 0xf;
                                    if ((int)uVar68 <= psVar52->code_bits) {
                                      psVar52->code_buffer = psVar52->code_buffer << (sbyte)uVar68;
                                      psVar52->code_bits = psVar52->code_bits - uVar68;
                                      uVar72 = (ulong)(uVar59 + 1);
                                      psVar79[""[(int)uVar59]] =
                                           (short)((uVar43 >> 8) << (bVar40 & 0x1f));
                                      iVar45 = 0 << (bVar40 & 0x1f);
                                      bVar83 = true;
                                      goto LAB_001704a1;
                                    }
LAB_0017048c:
                                    stbi__g_failure_reason = "bad huffman code";
                                    iVar45 = 1;
LAB_0017049f:
                                    bVar83 = false;
                                  }
LAB_001704a1:
                                  uVar81 = 0;
                                  bVar82 = true;
                                  if (iVar45 != 0) {
                                    if (iVar45 != 2) {
                                      bVar82 = bVar83;
                                    }
                                    break;
                                  }
                                } while ((int)uVar72 <= psVar52->spec_end);
                              }
                              else {
                                psVar52->eob_run = iVar46 + -1;
                                uVar81 = 1;
                                bVar82 = false;
                              }
                              if (bVar82) goto LAB_0016fe5c;
                            }
                            else {
                              if (iVar46 == 0) {
                                iVar46 = 0x10000 << (bVar40 & 0x1f);
                                uVar43 = iVar46 >> 0x10;
                                local_498 = CONCAT44(local_498._4_4_,-uVar43);
                                do {
                                  if (psVar52->code_bits < 0x10) {
                                    stbi__grow_buffer_unsafe(psVar52);
                                  }
                                  uVar68 = psVar52->code_buffer;
                                  uVar81 = (ulong)psVar52->huff_ac[lVar71].fast[uVar68 >> 0x17];
                                  if (uVar81 == 0xff) {
                                    lVar60 = 0;
                                    do {
                                      lVar73 = lVar60;
                                      lVar60 = lVar73 + 1;
                                    } while ((uint)piVar1[lVar71 * 0x1a4 + lVar73 + -0x11] <=
                                             uVar68 >> 0x10);
                                    iVar45 = psVar52->code_bits;
                                    if (lVar60 == 8) {
                                      psVar52->code_bits = iVar45 + -0x10;
                                      uVar76 = 0xffffffff;
                                    }
                                    else {
                                      uVar76 = 0xffffffff;
                                      if (((int)(lVar73 + 10) <= iVar45) &&
                                         (uVar59 = (uVar68 >> (0x17U - (char)lVar60 & 0x1f) &
                                                   stbi__bmask[lVar73 + 10]) +
                                                   piVar1[lVar71 * 0x1a4 + lVar60], uVar59 < 0x100))
                                      {
                                        psVar52->code_bits = (iVar45 - (int)lVar60) + -9;
                                        psVar52->code_buffer =
                                             uVar68 << ((byte)(lVar73 + 10) & 0x1f);
                                        uVar81 = (ulong)uVar59;
                                        goto LAB_0016ffde;
                                      }
                                    }
                                  }
                                  else {
                                    bVar40 = psVar52->huff_ac[lVar71].size[uVar81];
                                    uVar76 = 0xffffffff;
                                    if ((int)(uint)bVar40 <= psVar52->code_bits) {
                                      psVar52->code_buffer = uVar68 << (bVar40 & 0x1f);
                                      psVar52->code_bits = psVar52->code_bits - (uint)bVar40;
LAB_0016ffde:
                                      uVar76 = (ulong)psVar52->huff_ac[lVar71].values[uVar81];
                                    }
                                  }
                                  uVar68 = (uint)uVar76;
                                  if ((int)uVar68 < 0) {
LAB_00170116:
                                    stbi__g_failure_reason = "bad huffman code";
                                    bVar83 = false;
                                  }
                                  else {
                                    uVar81 = uVar76 >> 4;
                                    sVar5 = (short)((uint)iVar46 >> 0x10);
                                    if ((uVar68 & 0xf) == 1) {
                                      if (psVar52->code_bits < 1) {
                                        stbi__grow_buffer_unsafe(psVar52);
                                      }
                                      uVar76 = uVar81;
                                      if (0 < psVar52->code_bits) {
                                        sVar44 = psVar52->code_buffer;
                                        psVar52->code_buffer = sVar44 * 2;
                                        psVar52->code_bits = psVar52->code_bits + -1;
                                        local_538 = sVar5;
                                        if ((int)sVar44 < 0) goto LAB_00170183;
                                      }
                                      local_538 = (short)local_498;
                                    }
                                    else {
                                      if ((uVar76 & 0xf) != 0) goto LAB_00170116;
                                      local_538 = 0;
                                      uVar76 = 0xf;
                                      if (uVar68 < 0xf0) {
                                        iVar45 = (int)uVar81;
                                        psVar52->eob_run = ~(-1 << ((byte)uVar81 & 0x1f));
                                        uVar76 = 0x40;
                                        if (0xf < uVar68) {
                                          if (psVar52->code_bits < iVar45) {
                                            stbi__grow_buffer_unsafe(psVar52);
                                          }
                                          local_538 = 0;
                                          uVar68 = 0;
                                          if (iVar45 <= psVar52->code_bits) {
                                            bVar40 = (byte)uVar81 & 0x1f;
                                            uVar68 = psVar52->code_buffer << bVar40 |
                                                     psVar52->code_buffer >> 0x20 - bVar40;
                                            uVar59 = stbi__bmask[uVar81];
                                            psVar52->code_buffer = ~uVar59 & uVar68;
                                            uVar68 = uVar68 & uVar59;
                                            psVar52->code_bits = psVar52->code_bits - iVar45;
                                          }
                                          psVar52->eob_run = psVar52->eob_run + uVar68;
                                        }
                                      }
                                    }
LAB_00170183:
                                    uVar72 = (ulong)(int)uVar72;
                                    do {
                                      if ((long)psVar52->spec_end < (long)uVar72) break;
                                      bVar40 = ""[uVar72];
                                      if (psVar79[bVar40] == 0) {
                                        if ((int)uVar76 == 0) {
                                          psVar79[bVar40] = local_538;
                                          bVar83 = false;
                                          uVar76 = 0;
                                        }
                                        else {
                                          uVar76 = (ulong)((int)uVar76 - 1);
                                          bVar83 = true;
                                        }
                                      }
                                      else {
                                        if (psVar52->code_bits < 1) {
                                          stbi__grow_buffer_unsafe(psVar52);
                                        }
                                        bVar83 = true;
                                        if (0 < psVar52->code_bits) {
                                          sVar44 = psVar52->code_buffer;
                                          psVar52->code_buffer = sVar44 * 2;
                                          psVar52->code_bits = psVar52->code_bits + -1;
                                          if (((int)sVar44 < 0) &&
                                             (sVar6 = psVar79[bVar40], (uVar43 & (int)sVar6) == 0))
                                          {
                                            sVar30 = sVar5;
                                            if (sVar6 < 1) {
                                              sVar30 = -sVar5;
                                            }
                                            psVar79[bVar40] = sVar6 + sVar30;
                                          }
                                        }
                                      }
                                      uVar72 = uVar72 + 1;
                                    } while (bVar83);
                                    bVar83 = true;
                                  }
                                  if (!bVar83) {
                                    uVar81 = 0;
                                    goto LAB_0016fe61;
                                  }
                                } while ((int)uVar72 <= psVar52->spec_end);
                              }
                              else {
                                psVar52->eob_run = iVar46 + -1;
                                if (psVar52->spec_start <= psVar52->spec_end) {
                                  uVar43 = (0x10000 << (bVar40 & 0x1f)) >> 0x10;
                                  do {
                                    bVar40 = ""[uVar72];
                                    if (psVar79[bVar40] != 0) {
                                      if (psVar52->code_bits < 1) {
                                        stbi__grow_buffer_unsafe(psVar52);
                                      }
                                      if (0 < psVar52->code_bits) {
                                        sVar44 = psVar52->code_buffer;
                                        psVar52->code_buffer = sVar44 * 2;
                                        psVar52->code_bits = psVar52->code_bits + -1;
                                        if (((int)sVar44 < 0) &&
                                           (sVar5 = psVar79[bVar40], (uVar43 & (int)sVar5) == 0)) {
                                          uVar68 = -uVar43;
                                          if (0 < sVar5) {
                                            uVar68 = uVar43;
                                          }
                                          psVar79[bVar40] = (short)uVar68 + sVar5;
                                        }
                                      }
                                    }
                                    bVar83 = (long)uVar72 < (long)psVar52->spec_end;
                                    uVar72 = uVar72 + 1;
                                  } while (bVar83);
                                }
                              }
LAB_0016fe5c:
                              uVar81 = 1;
                            }
LAB_0016fe61:
                            bVar83 = (int)uVar81 == 0;
                            if (bVar83) {
                              local_520._0_4_ = 0;
                            }
                            local_520 = (ulong)(uint)local_520;
                            paVar66 = local_4a0;
                            if (bVar83) {
                              bVar83 = false;
                            }
                            else {
LAB_0016fe86:
                              iVar46 = psVar52->todo;
                              psVar52->todo = iVar46 + -1;
                              bVar83 = true;
                              if (iVar46 < 2) {
                                if (psVar52->code_bits < 0x18) {
                                  stbi__grow_buffer_unsafe(psVar52);
                                  uVar81 = extraout_RDX_06;
                                }
                                if ((psVar52->marker & 0xf8) == 0xd0) {
                                  psVar52->code_buffer = 0;
                                  psVar52->code_bits = 0;
                                  psVar52->nomore = 0;
                                  psVar52->img_comp[3].dc_pred = 0;
                                  psVar52->img_comp[2].dc_pred = 0;
                                  psVar52->img_comp[1].dc_pred = 0;
                                  psVar52->img_comp[0].dc_pred = 0;
                                  psVar52->marker = 0xff;
                                  iVar46 = psVar52->restart_interval;
                                  uVar81 = 0x7fffffff;
                                  if (iVar46 == 0) {
                                    iVar46 = 0x7fffffff;
                                  }
                                  psVar52->todo = iVar46;
                                  psVar52->eob_run = 0;
                                }
                                else {
                                  local_520 = 1;
                                  bVar83 = false;
                                }
                              }
                            }
                          }
                          uVar43 = (uint)uVar81;
                          if (!bVar83) {
                            uVar72 = local_520 & 0xffffffff;
                            goto LAB_00170bbb;
                          }
                          uVar64 = uVar64 + 1;
                        } while (uVar64 != (uint)local_4b0);
                      }
                      uVar43 = (uint)uVar81;
                      uVar72 = 1;
                      iVar42 = iVar42 + 1;
                    } while (iVar42 != (int)local_470);
                  }
                }
                else {
                  uVar72 = 1;
                  if (0 < psVar52->img_mcu_y) {
                    iVar42 = 0;
                    do {
                      if (0 < psVar52->img_mcu_x) {
                        iVar46 = 0;
                        do {
                          if (0 < psVar52->scan_n) {
                            uVar72 = 0;
                            do {
                              local_508 = uVar72;
                              iVar45 = psVar52->order[local_508];
                              if (0 < psVar52->img_comp[iVar45].v) {
                                iVar47 = 0;
                                bVar83 = true;
LAB_001707f0:
                                iVar75 = paVar2[iVar45].h;
                                if (iVar75 < 1) goto LAB_00170853;
                                iVar119 = 0;
                                while( true ) {
                                  iVar75 = stbi__jpeg_decode_block_prog_dc
                                                     (psVar52,paVar2[iVar45].coeff +
                                                              (iVar75 * iVar46 + iVar119 +
                                                              (paVar2[iVar45].v * iVar42 + iVar47) *
                                                              paVar2[iVar45].coeff_w) * 0x40,
                                                      (stbi__huffman *)
                                                      psVar52->huff_dc[paVar2[iVar45].hd].fast,
                                                      iVar45);
                                  uVar43 = (uint)extraout_RDX_10;
                                  uVar81 = extraout_RDX_10;
                                  if (iVar75 == 0) break;
                                  iVar119 = iVar119 + 1;
                                  iVar75 = paVar2[iVar45].h;
                                  if (iVar75 <= iVar119) goto LAB_00170853;
                                }
                                if (!bVar83) goto LAB_00170871;
LAB_00170ba8:
                                uVar72 = 0;
                                goto LAB_00170bbb;
                              }
LAB_00170871:
                              uVar72 = local_508 + 1;
                            } while ((long)(local_508 + 1) < (long)psVar52->scan_n);
                          }
                          uVar43 = (uint)uVar81;
                          iVar45 = psVar52->todo;
                          psVar52->todo = iVar45 + -1;
                          if (iVar45 < 2) {
                            if (psVar52->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar52);
                              uVar43 = extraout_EDX_01;
                            }
                            if ((psVar52->marker & 0xf8) != 0xd0) goto LAB_0017093e;
                            psVar52->code_buffer = 0;
                            psVar52->code_bits = 0;
                            psVar52->nomore = 0;
                            psVar52->img_comp[3].dc_pred = 0;
                            psVar52->img_comp[2].dc_pred = 0;
                            psVar52->img_comp[1].dc_pred = 0;
                            psVar52->img_comp[0].dc_pred = 0;
                            psVar52->marker = 0xff;
                            iVar45 = psVar52->restart_interval;
                            uVar81 = 0x7fffffff;
                            if (iVar45 == 0) {
                              iVar45 = 0x7fffffff;
                            }
                            psVar52->todo = iVar45;
                            psVar52->eob_run = 0;
                          }
                          iVar46 = iVar46 + 1;
                        } while (iVar46 < psVar52->img_mcu_x);
                      }
                      uVar43 = (uint)uVar81;
                      iVar42 = iVar42 + 1;
                    } while (iVar42 < psVar52->img_mcu_y);
LAB_0017093e:
                    uVar72 = 1;
                  }
                }
LAB_00170bbb:
                if ((int)uVar72 == 0) goto LAB_0017194c;
                if (psVar52->marker == 0xff) {
                  do {
                    psVar77 = psVar52->s;
                    if ((psVar77->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00170bf5:
                      if (psVar77->img_buffer_end <= psVar77->img_buffer) {
LAB_00170cf6:
                        uVar41 = 0xff;
                        break;
                      }
                    }
                    else {
                      iVar42 = (*(psVar77->io).eof)(psVar77->io_user_data);
                      if (iVar42 != 0) {
                        if (psVar77->read_from_callbacks != 0) goto LAB_00170bf5;
                        goto LAB_00170cf6;
                      }
                    }
                    psVar77 = psVar52->s;
                    pbVar62 = psVar77->img_buffer;
                    if (pbVar62 < psVar77->img_buffer_end) {
LAB_00170c3a:
                      psVar77->img_buffer = pbVar62 + 1;
                      uVar43 = (uint)*pbVar62;
                    }
                    else {
                      if (psVar77->read_from_callbacks != 0) {
                        stbi__refill_buffer(psVar77);
                        pbVar62 = psVar77->img_buffer;
                        goto LAB_00170c3a;
                      }
                      uVar43 = 0;
                    }
                    do {
                      uVar64 = uVar43;
                      if (uVar64 != 0xff) {
                        uVar43 = (uint)uVar72;
                        break;
                      }
                      psVar77 = psVar52->s;
                      if ((psVar77->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00170c76:
                        if (psVar77->img_buffer_end <= psVar77->img_buffer) {
LAB_00170cd5:
                          uVar43 = 0xff;
                          break;
                        }
                      }
                      else {
                        iVar42 = (*(psVar77->io).eof)(psVar77->io_user_data);
                        if (iVar42 != 0) {
                          if (psVar77->read_from_callbacks != 0) goto LAB_00170c76;
                          goto LAB_00170cd5;
                        }
                      }
                      psVar77 = psVar52->s;
                      pbVar62 = psVar77->img_buffer;
                      if (pbVar62 < psVar77->img_buffer_end) {
LAB_00170cb3:
                        psVar77->img_buffer = pbVar62 + 1;
                        bVar40 = *pbVar62;
                      }
                      else {
                        if (psVar77->read_from_callbacks != 0) {
                          stbi__refill_buffer(psVar77);
                          pbVar62 = psVar77->img_buffer;
                          goto LAB_00170cb3;
                        }
                        bVar40 = 0;
                      }
                      uVar43 = (uint)bVar40;
                    } while (0xfd < (byte)(bVar40 - 1));
                    uVar41 = (uchar)uVar43;
                    uVar72 = (ulong)uVar43;
                  } while (uVar64 != 0xff);
                  psVar52->marker = uVar41;
                }
                bVar40 = stbi__get_marker(psVar52);
                uVar64 = (uint)bVar40;
                uVar65 = extraout_RDX_13;
                if ((bVar40 & 0xf8) == 0xd0) goto LAB_0016f892;
                goto LAB_0016f861;
              }
              stbi__g_failure_reason = "bad SOS len";
            }
LAB_00171945:
            uVar43 = (uint)paVar66;
            goto LAB_0017194c;
          }
          if (uVar64 == 0xdc) {
            iVar42 = stbi__get16be(psVar52->s);
            sVar44 = stbi__get16be(psVar52->s);
            uVar65 = extraout_RDX_01;
            if (iVar42 == 4) {
              if (sVar44 == psVar52->s->img_y) {
                bVar40 = stbi__get_marker(psVar52);
                uVar64 = (uint)bVar40;
                bVar83 = true;
                uVar65 = extraout_RDX_02;
              }
              else {
                stbi__g_failure_reason = "bad DNL height";
                uVar64 = 0xdc;
                bVar83 = false;
              }
            }
            else {
              stbi__g_failure_reason = "bad DNL len";
              uVar64 = 0xdc;
              bVar83 = false;
            }
            uVar43 = (uint)uVar65;
            if (!bVar83) goto LAB_0017194c;
            goto LAB_0016f861;
          }
          if (uVar64 != 0xd9) {
            iVar42 = stbi__process_marker(psVar52,uVar64);
            uVar43 = extraout_EDX_00;
            if (iVar42 == 0) goto LAB_001710b6;
LAB_0016f892:
            bVar40 = stbi__get_marker(psVar52);
            uVar64 = (uint)bVar40;
            uVar65 = extraout_RDX_00;
            goto LAB_0016f861;
          }
          if ((psVar52->progressive != 0) && (0 < psVar52->s->img_n)) {
            lVar71 = 0;
            do {
              iVar42 = psVar52->img_comp[lVar71].y + 7 >> 3;
              if (0 < iVar42) {
                uVar43 = paVar2[lVar71].x + 7 >> 3;
                iVar46 = 0;
                do {
                  if (0 < (int)uVar43) {
                    uVar81 = 0;
                    do {
                      psVar79 = paVar2[lVar71].coeff +
                                (paVar2[lVar71].coeff_w * iVar46 + (int)uVar81) * 0x40;
                      iVar45 = paVar2[lVar71].tq;
                      lVar60 = 0;
                      do {
                        psVar79[lVar60] = psVar79[lVar60] * psVar52->dequant[iVar45][lVar60];
                        lVar60 = lVar60 + 1;
                      } while (lVar60 != 0x40);
                      (*psVar52->idct_block_kernel)
                                (paVar2[lVar71].data +
                                 uVar81 * 8 + (long)(iVar46 * 8 * paVar2[lVar71].w2),
                                 paVar2[lVar71].w2,psVar79);
                      uVar81 = uVar81 + 1;
                      uVar65 = extraout_RDX_14;
                    } while (uVar81 != uVar43);
                  }
                  iVar46 = iVar46 + 1;
                } while (iVar46 != iVar42);
              }
              uVar43 = (uint)uVar65;
              lVar71 = lVar71 + 1;
            } while (lVar71 < psVar52->s->img_n);
          }
LAB_001710b6:
          if (req_comp == 0) {
            req_comp = (uint)(2 < psVar52->s->img_n) * 2 + 1;
          }
          uVar64 = psVar52->s->img_n;
          if (uVar64 == 3) {
            bVar83 = true;
            if (psVar52->rgb != 3) {
              if (psVar52->app14_color_transform != 0) goto LAB_001710f7;
              bVar83 = psVar52->jfif == 0;
            }
          }
          else {
LAB_001710f7:
            bVar83 = false;
          }
          uVar68 = 1;
          if (bVar83) {
            uVar68 = uVar64;
          }
          if (2 < req_comp) {
            uVar68 = uVar64;
          }
          if (uVar64 != 3) {
            uVar68 = uVar64;
          }
          if (0 < (int)uVar68) {
            _local_4c8 = (undefined1  [16])0x0;
            _local_4d8 = (undefined1  [16])0x0;
            pvVar51 = (void *)0x0;
            lVar71 = 0;
            do {
              psVar77 = psVar52->s;
              sVar44 = psVar77->img_x;
              pvVar55 = malloc((ulong)(sVar44 + 3));
              *(void **)((long)&psVar52->img_comp[0].linebuf + lVar71 * 2) = pvVar55;
              if (pvVar55 == (void *)0x0) {
                stbi__free_jpeg_components(psVar52,psVar77->img_n,why);
                stbi__g_failure_reason = "outofmem";
              }
              else {
                uVar81 = (long)psVar52->img_h_max /
                         (long)*(int *)((long)&psVar52->img_comp[0].h + lVar71 * 2);
                iVar42 = (int)uVar81;
                *(int *)((long)aiStack_410 + lVar71 + -0x10) = iVar42;
                iVar46 = psVar52->img_v_max / *(int *)((long)&psVar52->img_comp[0].v + lVar71 * 2);
                *(int *)((long)aiStack_410 + lVar71 + -0xc) = iVar46;
                *(int *)((long)aiStack_410 + lVar71 + -4) = iVar46 >> 1;
                *(int *)((long)aiStack_410 + lVar71 + -8) =
                     (int)((ulong)((sVar44 + iVar42) - 1) / (uVar81 & 0xffffffff));
                *(undefined4 *)((long)aiStack_410 + lVar71) = 0;
                uVar65 = *(undefined8 *)((long)&psVar52->img_comp[0].data + lVar71 * 2);
                *(undefined8 *)((long)aiStack_410 + lVar71 + -0x18) = uVar65;
                *(undefined8 *)((long)aiStack_410 + lVar71 + -0x20) = uVar65;
                if ((iVar42 == 1) && (iVar46 == 1)) {
                  pcVar56 = resample_row_1;
                }
                else if ((iVar42 == 1) && (iVar46 == 2)) {
                  pcVar56 = stbi__resample_row_v_2;
                }
                else if ((iVar42 == 2) && (iVar46 == 1)) {
                  pcVar56 = stbi__resample_row_h_2;
                }
                else if ((iVar42 == 2) && (iVar46 == 2)) {
                  pcVar56 = psVar52->resample_row_hv_2_kernel;
                }
                else {
                  pcVar56 = stbi__resample_row_generic;
                }
                *(code **)((long)&local_438.s + lVar71) = pcVar56;
              }
              if (pvVar55 == (void *)0x0) goto LAB_00171962;
              lVar71 = lVar71 + 0x30;
            } while ((ulong)uVar68 * 0x30 != lVar71);
            psVar77 = psVar52->s;
            sVar44 = psVar77->img_y;
            pvVar51 = stbi__malloc_mad3(req_comp,psVar77->img_x,sVar44,1);
            if (pvVar51 != (void *)0x0) {
              iVar42 = why_00;
              if (sVar44 != 0) {
                iVar46 = 0;
                uVar43 = 0;
                do {
                  sVar44 = psVar77->img_x;
                  puVar78 = (undefined8 *)local_4d8;
                  lVar71 = 0;
                  do {
                    puVar57 = (undefined8 *)((long)aiStack_410 + lVar71 + -0x18);
                    iVar42 = *(int *)((long)aiStack_410 + lVar71 + -4);
                    iVar45 = *(int *)((long)aiStack_410 + lVar71 + -0xc);
                    iVar47 = iVar45 >> 1;
                    puVar3 = (undefined8 *)((long)aiStack_410 + lVar71 + -0x20);
                    puVar61 = puVar57;
                    if (iVar42 < iVar47) {
                      puVar61 = puVar3;
                    }
                    if (iVar47 <= iVar42) {
                      puVar57 = puVar3;
                    }
                    auVar124 = (**(code **)((long)&local_438.s + lVar71))
                                         (*(undefined8 *)
                                           ((long)&psVar52->img_comp[0].linebuf + lVar71 * 2),
                                          *puVar61,*puVar57,
                                          *(undefined4 *)((long)aiStack_410 + lVar71 + -8));
                    psVar67 = auVar124._8_8_;
                    *puVar78 = auVar124._0_8_;
                    *(int *)((long)aiStack_410 + lVar71 + -4) = iVar42 + 1;
                    if (iVar45 <= iVar42 + 1) {
                      *(undefined4 *)((long)aiStack_410 + lVar71 + -4) = 0;
                      lVar60 = *(long *)((long)aiStack_410 + lVar71 + -0x18);
                      *(long *)((long)aiStack_410 + lVar71 + -0x20) = lVar60;
                      iVar42 = *(int *)((long)aiStack_410 + lVar71) + 1;
                      *(int *)((long)aiStack_410 + lVar71) = iVar42;
                      if (iVar42 < *(int *)((long)&psVar52->img_comp[0].y + lVar71 * 2)) {
                        *(long *)((long)aiStack_410 + lVar71 + -0x18) =
                             lVar60 + *(int *)((long)&psVar52->img_comp[0].w2 + lVar71 * 2);
                      }
                    }
                    lVar71 = lVar71 + 0x30;
                    puVar78 = puVar78 + 1;
                  } while ((ulong)uVar68 * 0x30 != lVar71);
                  if (req_comp < 3) {
                    psVar77 = psVar52->s;
                    if (bVar83) {
                      if (req_comp == 1) {
                        if (psVar77->img_x != 0) {
                          uVar81 = 0;
                          do {
                            bVar40 = *(byte *)(local_4c8._0_8_ + uVar81);
                            *(char *)((long)pvVar51 + uVar81 + sVar44 * iVar46) =
                                 (char)((uint)bVar40 * 2 + ((uint)bVar40 + (uint)bVar40 * 8) * 3 +
                                        (uint)stack0xfffffffffffffb30[uVar81] * 0x96 +
                                        (uint)*(byte *)(local_4d8._0_8_ + uVar81) * 0x4d >> 8);
                            uVar81 = uVar81 + 1;
                            psVar67 = stack0xfffffffffffffb30;
                          } while (uVar81 < psVar77->img_x);
                        }
                      }
                      else if (psVar77->img_x != 0) {
                        uVar81 = 0;
                        do {
                          bVar40 = *(byte *)(local_4c8._0_8_ + uVar81);
                          *(char *)((long)pvVar51 + uVar81 * 2 + (ulong)(sVar44 * iVar46)) =
                               (char)((uint)bVar40 * 2 + ((uint)bVar40 + (uint)bVar40 * 8) * 3 +
                                      (uint)stack0xfffffffffffffb30[uVar81] * 0x96 +
                                      (uint)*(byte *)(local_4d8._0_8_ + uVar81) * 0x4d >> 8);
                          *(undefined1 *)((long)pvVar51 + uVar81 * 2 + (ulong)(sVar44 * iVar46) + 1)
                               = 0xff;
                          uVar81 = uVar81 + 1;
                          psVar67 = stack0xfffffffffffffb30;
                        } while (uVar81 < psVar77->img_x);
                      }
                    }
                    else if (psVar77->img_n == 4) {
                      if (psVar52->app14_color_transform == 2) {
                        if (psVar77->img_x != 0) {
                          puVar69 = (undefined1 *)((long)pvVar51 + (ulong)(sVar44 * iVar46) + 1);
                          uVar81 = 0;
                          do {
                            iVar42 = (*(byte *)(local_4d8._0_8_ + uVar81) ^ 0xff) *
                                     (uint)stack0xfffffffffffffb40[uVar81];
                            puVar69[-1] = (char)((iVar42 + 0x80U >> 8) + iVar42 + 0x80 >> 8);
                            *puVar69 = 0xff;
                            uVar81 = uVar81 + 1;
                            puVar69 = puVar69 + (uint)req_comp;
                            psVar67 = stack0xfffffffffffffb40;
                          } while (uVar81 < psVar77->img_x);
                        }
                      }
                      else {
                        if (psVar52->app14_color_transform != 0) goto LAB_001716d2;
                        if (psVar77->img_x != 0) {
                          puVar69 = (undefined1 *)((long)pvVar51 + (ulong)(sVar44 * iVar46) + 1);
                          uVar81 = 0;
                          do {
                            bVar40 = stack0xfffffffffffffb40[uVar81];
                            iVar42 = (uint)*(byte *)(local_4d8._0_8_ + uVar81) * (uint)bVar40;
                            iVar45 = (uint)stack0xfffffffffffffb30[uVar81] * (uint)bVar40;
                            puVar69[-1] = (char)(((uint)*(byte *)(local_4c8._0_8_ + uVar81) *
                                                  (uint)bVar40 +
                                                  ((uint)*(byte *)(local_4c8._0_8_ + uVar81) *
                                                   (uint)bVar40 + 0x80 >> 8) + 0x80 >> 8 & 0xff) *
                                                 0x1d + (iVar45 + (iVar45 + 0x80U >> 8) + 0x80 >> 8
                                                        & 0xff) * 0x96 +
                                                        (iVar42 + (iVar42 + 0x80U >> 8) + 0x80 >> 8
                                                        & 0xff) * 0x4d >> 8);
                            *puVar69 = 0xff;
                            uVar81 = uVar81 + 1;
                            puVar69 = puVar69 + (uint)req_comp;
                            psVar67 = (stbi_uc *)local_4d8._0_8_;
                          } while (uVar81 < psVar77->img_x);
                        }
                      }
                    }
                    else {
LAB_001716d2:
                      uVar64 = psVar77->img_x;
                      psVar67 = (stbi_uc *)(ulong)uVar64;
                      if (req_comp == 1) {
                        if (uVar64 != 0) {
                          psVar67 = (stbi_uc *)0x0;
                          do {
                            psVar67[(ulong)(sVar44 * iVar46) + (long)pvVar51] =
                                 *(stbi_uc *)(local_4d8._0_8_ + (long)psVar67);
                            psVar67 = psVar67 + 1;
                          } while (psVar67 < (stbi_uc *)(ulong)psVar77->img_x);
                        }
                      }
                      else if (uVar64 != 0) {
                        psVar67 = (stbi_uc *)0x0;
                        do {
                          *(stbi_uc *)((long)pvVar51 + (long)psVar67 * 2 + (ulong)(sVar44 * iVar46))
                               = *(stbi_uc *)(local_4d8._0_8_ + (long)psVar67);
                          *(undefined1 *)
                           ((long)pvVar51 + (long)psVar67 * 2 + (ulong)(sVar44 * iVar46) + 1) = 0xff
                          ;
                          psVar67 = psVar67 + 1;
                        } while (psVar67 < (stbi_uc *)(ulong)psVar77->img_x);
                      }
                    }
                  }
                  else {
                    psVar70 = (stbi_uc *)((ulong)(uVar43 * req_comp * sVar44) + (long)pvVar51);
                    psVar77 = psVar52->s;
                    if (psVar77->img_n == 3) {
                      if (bVar83) {
                        if (psVar77->img_x != 0) {
                          puVar69 = (undefined1 *)((long)pvVar51 + (ulong)(sVar44 * iVar46) + 3);
                          uVar81 = 0;
                          do {
                            puVar69[-3] = *(stbi_uc *)(local_4d8._0_8_ + uVar81);
                            puVar69[-2] = stack0xfffffffffffffb30[uVar81];
                            puVar69[-1] = *(stbi_uc *)(local_4c8._0_8_ + uVar81);
                            *puVar69 = 0xff;
                            uVar81 = uVar81 + 1;
                            puVar69 = puVar69 + (uint)req_comp;
                            psVar67 = (stbi_uc *)local_4c8._0_8_;
                          } while (uVar81 < psVar77->img_x);
                        }
                      }
                      else {
LAB_00171743:
                        (*psVar52->YCbCr_to_RGB_kernel)
                                  (psVar70,(stbi_uc *)local_4d8._0_8_,stack0xfffffffffffffb30,
                                   (stbi_uc *)local_4c8._0_8_,psVar77->img_x,req_comp);
                        psVar67 = extraout_RDX_15;
                      }
                    }
                    else if (psVar77->img_n == 4) {
                      if (psVar52->app14_color_transform == 2) {
                        (*psVar52->YCbCr_to_RGB_kernel)
                                  (psVar70,(stbi_uc *)local_4d8._0_8_,stack0xfffffffffffffb30,
                                   (stbi_uc *)local_4c8._0_8_,psVar77->img_x,req_comp);
                        psVar77 = psVar52->s;
                        psVar67 = extraout_RDX_16;
                        if (psVar77->img_x != 0) {
                          pbVar62 = (byte *)((long)pvVar51 + (ulong)(sVar44 * iVar46) + 2);
                          psVar67 = (stbi_uc *)0x0;
                          do {
                            bVar40 = psVar67[(long)stack0xfffffffffffffb40];
                            iVar42 = (pbVar62[-2] ^ 0xff) * (uint)bVar40;
                            pbVar62[-2] = (byte)((iVar42 + 0x80U >> 8) + iVar42 + 0x80 >> 8);
                            iVar42 = (pbVar62[-1] ^ 0xff) * (uint)bVar40;
                            pbVar62[-1] = (byte)((iVar42 + 0x80U >> 8) + iVar42 + 0x80 >> 8);
                            iVar42 = (*pbVar62 ^ 0xff) * (uint)bVar40;
                            *pbVar62 = (byte)((iVar42 + 0x80U >> 8) + iVar42 + 0x80 >> 8);
                            psVar67 = psVar67 + 1;
                            pbVar62 = pbVar62 + (uint)req_comp;
                          } while (psVar67 < (stbi_uc *)(ulong)psVar77->img_x);
                        }
                      }
                      else {
                        if (psVar52->app14_color_transform != 0) goto LAB_00171743;
                        if (psVar77->img_x != 0) {
                          puVar69 = (undefined1 *)((long)pvVar51 + (ulong)(sVar44 * iVar46) + 3);
                          uVar81 = 0;
                          do {
                            bVar40 = stack0xfffffffffffffb40[uVar81];
                            iVar42 = (uint)*(byte *)(local_4d8._0_8_ + uVar81) * (uint)bVar40;
                            puVar69[-3] = (char)((iVar42 + 0x80U >> 8) + iVar42 + 0x80 >> 8);
                            iVar42 = (uint)stack0xfffffffffffffb30[uVar81] * (uint)bVar40;
                            puVar69[-2] = (char)((iVar42 + 0x80U >> 8) + iVar42 + 0x80 >> 8);
                            puVar69[-1] = (char)(((uint)*(byte *)(local_4c8._0_8_ + uVar81) *
                                                  (uint)bVar40 + 0x80 >> 8) +
                                                 (uint)*(byte *)(local_4c8._0_8_ + uVar81) *
                                                 (uint)bVar40 + 0x80 >> 8);
                            *puVar69 = 0xff;
                            uVar81 = uVar81 + 1;
                            puVar69 = puVar69 + (uint)req_comp;
                            psVar67 = stack0xfffffffffffffb30;
                          } while (uVar81 < psVar77->img_x);
                        }
                      }
                    }
                    else if (psVar77->img_x != 0) {
                      puVar69 = (undefined1 *)((long)pvVar51 + (ulong)(sVar44 * iVar46) + 3);
                      psVar70 = (stbi_uc *)0x0;
                      do {
                        sVar39 = *(stbi_uc *)(local_4d8._0_8_ + (long)psVar70);
                        puVar69[-1] = sVar39;
                        puVar69[-2] = sVar39;
                        puVar69[-3] = sVar39;
                        *puVar69 = 0xff;
                        psVar70 = psVar70 + 1;
                        psVar67 = (stbi_uc *)(ulong)psVar77->img_x;
                        puVar69 = puVar69 + (uint)req_comp;
                      } while (psVar70 < psVar67);
                    }
                  }
                  iVar42 = (int)psVar67;
                  uVar43 = uVar43 + 1;
                  psVar77 = psVar52->s;
                  iVar46 = iVar46 + req_comp;
                } while (uVar43 < psVar77->img_y);
              }
              stbi__free_jpeg_components(psVar52,psVar77->img_n,iVar42);
              psVar77 = psVar52->s;
              *local_480 = psVar77->img_x;
              *local_478 = psVar77->img_y;
              if (comp != (int *)0x0) {
                *comp = (uint)(2 < psVar77->img_n) * 2 + 1;
              }
              goto LAB_00171962;
            }
            stbi__free_jpeg_components(psVar52,psVar77->img_n,why_00);
            stbi__g_failure_reason = "outofmem";
            goto LAB_0017195f;
          }
        }
        stbi__free_jpeg_components(psVar52,uVar64,uVar43);
      }
      else {
        stbi__g_failure_reason = "bad req_comp";
      }
LAB_0017195f:
      pvVar51 = (void *)0x0;
LAB_00171962:
      free(psVar52);
      return pvVar51;
    }
    stbi__g_failure_reason = "no SOI";
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    free(psVar52);
    y = (int *)local_478;
    x = (int *)local_480;
  }
  psVar67 = s->img_buffer;
  if (psVar67 < s->img_buffer_end) {
LAB_0016f620:
    s->img_buffer = psVar67 + 1;
    bVar83 = *psVar67 != 'P';
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar67 = s->img_buffer;
      goto LAB_0016f620;
    }
    bVar83 = true;
  }
  psVar67 = s->img_buffer;
  if (psVar67 < s->img_buffer_end) {
LAB_0016f65c:
    s->img_buffer = psVar67 + 1;
    bVar82 = (byte)(*psVar67 - 0x37) < 0xfe;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar67 = s->img_buffer;
      goto LAB_0016f65c;
    }
    bVar82 = true;
  }
  if ((bool)(bVar83 | bVar82)) {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    stbi__g_failure_reason = "unknown image type";
    return (void *)0x0;
  }
  y_00 = &s->img_y;
  piVar1 = &s->img_n;
  iVar42 = stbi__pnm_info(s,(int *)s,(int *)y_00,piVar1);
  ri->bits_per_channel = iVar42;
  if (iVar42 == 0) {
    return (void *)0x0;
  }
  if ((*y_00 < 0x1000001) && (s->img_x < 0x1000001)) {
    *x = s->img_x;
    *y = *y_00;
    if (comp != (int *)0x0) {
      *comp = *piVar1;
    }
    iVar42 = s->img_n;
    sVar44 = s->img_x;
    sVar7 = s->img_y;
    iVar45 = ri->bits_per_channel;
    iVar47 = iVar45 + 7;
    if (-1 < iVar45) {
      iVar47 = iVar45;
    }
    iVar47 = iVar47 >> 3;
    iVar45 = stbi__mad4sizes_valid(iVar42,sVar44,sVar7,iVar47,iVar46);
    if (iVar45 != 0) {
      psVar53 = (stbi__uint16 *)stbi__malloc_mad4(iVar42,sVar44,sVar7,iVar47,iVar46);
      if (psVar53 != (stbi__uint16 *)0x0) {
        iVar42 = stbi__getn(s,(stbi_uc *)psVar53,sVar44 * iVar42 * sVar7 * iVar47);
        if (iVar42 == 0) {
          free(psVar53);
          stbi__g_failure_reason = "bad PNM";
          return (void *)0x0;
        }
        if (req_comp == 0) {
          return psVar53;
        }
        iVar42 = *piVar1;
        if (iVar42 == req_comp) {
          return psVar53;
        }
        if (ri->bits_per_channel == 0x10) {
          psVar53 = stbi__convert_format16(psVar53,iVar42,req_comp,s->img_x,s->img_y);
          return psVar53;
        }
        puVar54 = stbi__convert_format((uchar *)psVar53,iVar42,req_comp,s->img_x,s->img_y);
        return puVar54;
      }
LAB_00170ee6:
      stbi__g_failure_reason = "outofmem";
      return (void *)0x0;
    }
  }
LAB_00170edd:
  stbi__g_failure_reason = "too large";
  return (void *)0x0;
LAB_00170853:
  iVar47 = iVar47 + 1;
  bVar83 = iVar47 < paVar2[iVar45].v;
  if (paVar2[iVar45].v <= iVar47) goto LAB_00170871;
  goto LAB_001707f0;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}